

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx::CurveNiIntersector1<8>::
     occluded_n<embree::avx::OrientedCurve1Intersector1<embree::CatmullRomCurveT,7,8>,embree::avx::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  undefined8 uVar2;
  ulong uVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Primitive PVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  void *pvVar10;
  __int_type_conflict _Var11;
  long lVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  byte bVar64;
  uint uVar65;
  ulong uVar66;
  long lVar67;
  uint uVar68;
  ulong uVar70;
  ulong uVar71;
  ulong uVar72;
  undefined4 uVar73;
  undefined8 unaff_R14;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar78 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [32];
  undefined1 auVar106 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar107 [16];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  float fVar134;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  float fVar162;
  float fVar163;
  float fVar165;
  float fVar166;
  float fVar167;
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  float fVar164;
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  float t1;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  float fVar195;
  float fVar212;
  float fVar213;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar215;
  float fVar216;
  float fVar217;
  undefined1 auVar208 [32];
  float fVar214;
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  float fVar218;
  float fVar228;
  float fVar229;
  vfloat4 b0;
  float fVar230;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  float fVar231;
  float fVar233;
  float fVar234;
  undefined1 auVar225 [32];
  undefined1 auVar232 [16];
  undefined1 auVar227 [64];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [64];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  float fVar264;
  float fVar266;
  undefined1 auVar261 [32];
  undefined1 auVar256 [16];
  float fVar265;
  undefined1 auVar262 [32];
  undefined1 auVar263 [64];
  float fVar267;
  float fVar277;
  float fVar278;
  vfloat4 a0_1;
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar270 [16];
  float fVar280;
  float fVar281;
  float fVar282;
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  float fVar279;
  undefined1 auVar275 [32];
  undefined1 auVar276 [64];
  __m128 a;
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar283 [16];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [64];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [64];
  float fVar301;
  float fVar307;
  undefined1 auVar302 [16];
  float fVar305;
  float fVar306;
  float fVar308;
  float fVar309;
  float fVar310;
  float in_register_0000151c;
  undefined1 auVar303 [32];
  float fVar311;
  undefined1 auVar304 [64];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [32];
  float fVar318;
  undefined1 auVar317 [64];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  float in_register_0000159c;
  undefined1 auVar323 [32];
  float fVar331;
  vfloat4 a0;
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  float in_register_000015dc;
  undefined1 auVar330 [64];
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_508 [8];
  float fStack_500;
  float fStack_4fc;
  undefined1 local_4f8 [8];
  float fStack_4f0;
  float fStack_4ec;
  int local_4cc;
  undefined1 local_4c8 [8];
  float fStack_4c0;
  float fStack_4bc;
  undefined1 local_4b8 [8];
  float fStack_4b0;
  float fStack_4ac;
  undefined1 local_4a8 [8];
  float fStack_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  ulong local_480;
  float local_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  undefined1 local_468 [8];
  float fStack_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  undefined1 local_448 [8];
  float fStack_440;
  float fStack_43c;
  undefined1 auStack_438 [16];
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  undefined1 local_3f8 [8];
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [8];
  float fStack_3d0;
  float fStack_3cc;
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [32];
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  ulong local_310;
  RTCFilterFunctionNArguments local_308;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  uint auStack_2c8 [4];
  undefined8 local_2b8;
  undefined4 local_2b0;
  undefined8 local_2ac;
  undefined4 local_2a4;
  undefined4 local_2a0;
  uint local_29c;
  uint local_298;
  undefined1 local_288 [8];
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  undefined1 local_228 [16];
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  float afStack_1d8 [8];
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar69;
  undefined1 auVar226 [32];
  undefined1 auVar324 [32];
  
  PVar7 = prim[1];
  uVar66 = (ulong)(byte)PVar7;
  auVar82 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar66 * 0x19 + 6));
  fVar134 = *(float *)(prim + uVar66 * 0x19 + 0x12);
  auVar104._0_4_ = fVar134 * auVar82._0_4_;
  auVar104._4_4_ = fVar134 * auVar82._4_4_;
  auVar104._8_4_ = fVar134 * auVar82._8_4_;
  auVar104._12_4_ = fVar134 * auVar82._12_4_;
  auVar196._0_4_ = fVar134 * (ray->dir).field_0.m128[0];
  auVar196._4_4_ = fVar134 * (ray->dir).field_0.m128[1];
  auVar196._8_4_ = fVar134 * (ray->dir).field_0.m128[2];
  auVar196._12_4_ = fVar134 * (ray->dir).field_0.m128[3];
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 4 + 6)));
  auVar253 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 4 + 10)));
  auVar93._16_16_ = auVar253;
  auVar93._0_16_ = auVar82;
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 5 + 6)));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar253 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 5 + 10)));
  auVar156._16_16_ = auVar253;
  auVar156._0_16_ = auVar82;
  auVar13 = vcvtdq2ps_avx(auVar156);
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 6 + 6)));
  auVar253 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 6 + 10)));
  auVar176._16_16_ = auVar253;
  auVar176._0_16_ = auVar82;
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0xb + 6)));
  auVar253 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0xb + 10)));
  auVar14 = vcvtdq2ps_avx(auVar176);
  auVar177._16_16_ = auVar253;
  auVar177._0_16_ = auVar82;
  auVar15 = vcvtdq2ps_avx(auVar177);
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0xc + 6)));
  auVar253 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0xc + 10)));
  auVar225._16_16_ = auVar253;
  auVar225._0_16_ = auVar82;
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0xd + 6)));
  auVar16 = vcvtdq2ps_avx(auVar225);
  auVar253 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0xd + 10)));
  auVar242._16_16_ = auVar253;
  auVar242._0_16_ = auVar82;
  auVar17 = vcvtdq2ps_avx(auVar242);
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0x12 + 6)));
  auVar253 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0x12 + 10)));
  auVar243._16_16_ = auVar253;
  auVar243._0_16_ = auVar82;
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0x13 + 6)));
  auVar253 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0x13 + 10)));
  auVar18 = vcvtdq2ps_avx(auVar243);
  auVar273._16_16_ = auVar253;
  auVar273._0_16_ = auVar82;
  auVar19 = vcvtdq2ps_avx(auVar273);
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0x14 + 6)));
  auVar253 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0x14 + 10)));
  auVar288._16_16_ = auVar253;
  auVar288._0_16_ = auVar82;
  auVar20 = vcvtdq2ps_avx(auVar288);
  auVar82 = vshufps_avx(auVar196,auVar196,0);
  auVar253 = vshufps_avx(auVar196,auVar196,0x55);
  auVar154 = vshufps_avx(auVar196,auVar196,0xaa);
  fVar134 = auVar154._0_4_;
  fVar162 = auVar154._4_4_;
  fVar163 = auVar154._8_4_;
  fVar164 = auVar154._12_4_;
  fVar165 = auVar253._0_4_;
  fVar166 = auVar253._4_4_;
  fVar167 = auVar253._8_4_;
  fVar195 = auVar253._12_4_;
  fVar212 = auVar82._0_4_;
  fVar213 = auVar82._4_4_;
  fVar214 = auVar82._8_4_;
  fVar215 = auVar82._12_4_;
  auVar303._0_4_ = fVar212 * auVar93._0_4_ + fVar165 * auVar13._0_4_ + fVar134 * auVar14._0_4_;
  auVar303._4_4_ = fVar213 * auVar93._4_4_ + fVar166 * auVar13._4_4_ + fVar162 * auVar14._4_4_;
  auVar303._8_4_ = fVar214 * auVar93._8_4_ + fVar167 * auVar13._8_4_ + fVar163 * auVar14._8_4_;
  auVar303._12_4_ = fVar215 * auVar93._12_4_ + fVar195 * auVar13._12_4_ + fVar164 * auVar14._12_4_;
  auVar303._16_4_ = fVar212 * auVar93._16_4_ + fVar165 * auVar13._16_4_ + fVar134 * auVar14._16_4_;
  auVar303._20_4_ = fVar213 * auVar93._20_4_ + fVar166 * auVar13._20_4_ + fVar162 * auVar14._20_4_;
  auVar303._24_4_ = fVar214 * auVar93._24_4_ + fVar167 * auVar13._24_4_ + fVar163 * auVar14._24_4_;
  auVar303._28_4_ = fVar195 + in_register_000015dc + in_register_0000151c;
  auVar297._0_4_ = fVar212 * auVar15._0_4_ + fVar165 * auVar16._0_4_ + auVar17._0_4_ * fVar134;
  auVar297._4_4_ = fVar213 * auVar15._4_4_ + fVar166 * auVar16._4_4_ + auVar17._4_4_ * fVar162;
  auVar297._8_4_ = fVar214 * auVar15._8_4_ + fVar167 * auVar16._8_4_ + auVar17._8_4_ * fVar163;
  auVar297._12_4_ = fVar215 * auVar15._12_4_ + fVar195 * auVar16._12_4_ + auVar17._12_4_ * fVar164;
  auVar297._16_4_ = fVar212 * auVar15._16_4_ + fVar165 * auVar16._16_4_ + auVar17._16_4_ * fVar134;
  auVar297._20_4_ = fVar213 * auVar15._20_4_ + fVar166 * auVar16._20_4_ + auVar17._20_4_ * fVar162;
  auVar297._24_4_ = fVar214 * auVar15._24_4_ + fVar167 * auVar16._24_4_ + auVar17._24_4_ * fVar163;
  auVar297._28_4_ = fVar195 + in_register_000015dc + in_register_0000159c;
  auVar208._0_4_ = fVar212 * auVar18._0_4_ + fVar165 * auVar19._0_4_ + auVar20._0_4_ * fVar134;
  auVar208._4_4_ = fVar213 * auVar18._4_4_ + fVar166 * auVar19._4_4_ + auVar20._4_4_ * fVar162;
  auVar208._8_4_ = fVar214 * auVar18._8_4_ + fVar167 * auVar19._8_4_ + auVar20._8_4_ * fVar163;
  auVar208._12_4_ = fVar215 * auVar18._12_4_ + fVar195 * auVar19._12_4_ + auVar20._12_4_ * fVar164;
  auVar208._16_4_ = fVar212 * auVar18._16_4_ + fVar165 * auVar19._16_4_ + auVar20._16_4_ * fVar134;
  auVar208._20_4_ = fVar213 * auVar18._20_4_ + fVar166 * auVar19._20_4_ + auVar20._20_4_ * fVar162;
  auVar208._24_4_ = fVar214 * auVar18._24_4_ + fVar167 * auVar19._24_4_ + auVar20._24_4_ * fVar163;
  auVar208._28_4_ = fVar215 + fVar195 + fVar164;
  auVar82 = vshufps_avx(auVar104,auVar104,0);
  auVar253 = vshufps_avx(auVar104,auVar104,0x55);
  auVar154 = vshufps_avx(auVar104,auVar104,0xaa);
  fVar162 = auVar154._0_4_;
  fVar163 = auVar154._4_4_;
  fVar164 = auVar154._8_4_;
  fVar165 = auVar154._12_4_;
  fVar213 = auVar253._0_4_;
  fVar214 = auVar253._4_4_;
  fVar215 = auVar253._8_4_;
  fVar216 = auVar253._12_4_;
  fVar166 = auVar82._0_4_;
  fVar167 = auVar82._4_4_;
  fVar195 = auVar82._8_4_;
  fVar212 = auVar82._12_4_;
  fVar134 = auVar93._28_4_;
  auVar126._0_4_ = fVar166 * auVar93._0_4_ + fVar213 * auVar13._0_4_ + fVar162 * auVar14._0_4_;
  auVar126._4_4_ = fVar167 * auVar93._4_4_ + fVar214 * auVar13._4_4_ + fVar163 * auVar14._4_4_;
  auVar126._8_4_ = fVar195 * auVar93._8_4_ + fVar215 * auVar13._8_4_ + fVar164 * auVar14._8_4_;
  auVar126._12_4_ = fVar212 * auVar93._12_4_ + fVar216 * auVar13._12_4_ + fVar165 * auVar14._12_4_;
  auVar126._16_4_ = fVar166 * auVar93._16_4_ + fVar213 * auVar13._16_4_ + fVar162 * auVar14._16_4_;
  auVar126._20_4_ = fVar167 * auVar93._20_4_ + fVar214 * auVar13._20_4_ + fVar163 * auVar14._20_4_;
  auVar126._24_4_ = fVar195 * auVar93._24_4_ + fVar215 * auVar13._24_4_ + fVar164 * auVar14._24_4_;
  auVar126._28_4_ = fVar134 + auVar13._28_4_ + auVar14._28_4_;
  auVar192._0_4_ = fVar166 * auVar15._0_4_ + auVar17._0_4_ * fVar162 + fVar213 * auVar16._0_4_;
  auVar192._4_4_ = fVar167 * auVar15._4_4_ + auVar17._4_4_ * fVar163 + fVar214 * auVar16._4_4_;
  auVar192._8_4_ = fVar195 * auVar15._8_4_ + auVar17._8_4_ * fVar164 + fVar215 * auVar16._8_4_;
  auVar192._12_4_ = fVar212 * auVar15._12_4_ + auVar17._12_4_ * fVar165 + fVar216 * auVar16._12_4_;
  auVar192._16_4_ = fVar166 * auVar15._16_4_ + auVar17._16_4_ * fVar162 + fVar213 * auVar16._16_4_;
  auVar192._20_4_ = fVar167 * auVar15._20_4_ + auVar17._20_4_ * fVar163 + fVar214 * auVar16._20_4_;
  auVar192._24_4_ = fVar195 * auVar15._24_4_ + auVar17._24_4_ * fVar164 + fVar215 * auVar16._24_4_;
  auVar192._28_4_ = fVar134 + auVar17._28_4_ + auVar14._28_4_;
  auVar178._0_4_ = fVar166 * auVar18._0_4_ + fVar213 * auVar19._0_4_ + auVar20._0_4_ * fVar162;
  auVar178._4_4_ = fVar167 * auVar18._4_4_ + fVar214 * auVar19._4_4_ + auVar20._4_4_ * fVar163;
  auVar178._8_4_ = fVar195 * auVar18._8_4_ + fVar215 * auVar19._8_4_ + auVar20._8_4_ * fVar164;
  auVar178._12_4_ = fVar212 * auVar18._12_4_ + fVar216 * auVar19._12_4_ + auVar20._12_4_ * fVar165;
  auVar178._16_4_ = fVar166 * auVar18._16_4_ + fVar213 * auVar19._16_4_ + auVar20._16_4_ * fVar162;
  auVar178._20_4_ = fVar167 * auVar18._20_4_ + fVar214 * auVar19._20_4_ + auVar20._20_4_ * fVar163;
  auVar178._24_4_ = fVar195 * auVar18._24_4_ + fVar215 * auVar19._24_4_ + auVar20._24_4_ * fVar164;
  auVar178._28_4_ = fVar134 + auVar16._28_4_ + fVar165;
  auVar94._8_4_ = 0x7fffffff;
  auVar94._0_8_ = 0x7fffffff7fffffff;
  auVar94._12_4_ = 0x7fffffff;
  auVar94._16_4_ = 0x7fffffff;
  auVar94._20_4_ = 0x7fffffff;
  auVar94._24_4_ = 0x7fffffff;
  auVar94._28_4_ = 0x7fffffff;
  auVar157._8_4_ = 0x219392ef;
  auVar157._0_8_ = 0x219392ef219392ef;
  auVar157._12_4_ = 0x219392ef;
  auVar157._16_4_ = 0x219392ef;
  auVar157._20_4_ = 0x219392ef;
  auVar157._24_4_ = 0x219392ef;
  auVar157._28_4_ = 0x219392ef;
  auVar93 = vandps_avx(auVar303,auVar94);
  auVar93 = vcmpps_avx(auVar93,auVar157,1);
  auVar13 = vblendvps_avx(auVar303,auVar157,auVar93);
  auVar93 = vandps_avx(auVar297,auVar94);
  auVar93 = vcmpps_avx(auVar93,auVar157,1);
  auVar14 = vblendvps_avx(auVar297,auVar157,auVar93);
  auVar93 = vandps_avx(auVar208,auVar94);
  auVar93 = vcmpps_avx(auVar93,auVar157,1);
  auVar93 = vblendvps_avx(auVar208,auVar157,auVar93);
  auVar15 = vrcpps_avx(auVar13);
  fVar134 = auVar15._0_4_;
  fVar162 = auVar15._4_4_;
  auVar16._4_4_ = auVar13._4_4_ * fVar162;
  auVar16._0_4_ = auVar13._0_4_ * fVar134;
  fVar163 = auVar15._8_4_;
  auVar16._8_4_ = auVar13._8_4_ * fVar163;
  fVar164 = auVar15._12_4_;
  auVar16._12_4_ = auVar13._12_4_ * fVar164;
  fVar165 = auVar15._16_4_;
  auVar16._16_4_ = auVar13._16_4_ * fVar165;
  fVar166 = auVar15._20_4_;
  auVar16._20_4_ = auVar13._20_4_ * fVar166;
  fVar167 = auVar15._24_4_;
  auVar16._24_4_ = auVar13._24_4_ * fVar167;
  auVar16._28_4_ = auVar208._28_4_;
  auVar261._8_4_ = 0x3f800000;
  auVar261._0_8_ = 0x3f8000003f800000;
  auVar261._12_4_ = 0x3f800000;
  auVar261._16_4_ = 0x3f800000;
  auVar261._20_4_ = 0x3f800000;
  auVar261._24_4_ = 0x3f800000;
  auVar261._28_4_ = 0x3f800000;
  auVar15 = vsubps_avx(auVar261,auVar16);
  fVar134 = fVar134 + fVar134 * auVar15._0_4_;
  fVar162 = fVar162 + fVar162 * auVar15._4_4_;
  fVar163 = fVar163 + fVar163 * auVar15._8_4_;
  fVar164 = fVar164 + fVar164 * auVar15._12_4_;
  fVar165 = fVar165 + fVar165 * auVar15._16_4_;
  fVar166 = fVar166 + fVar166 * auVar15._20_4_;
  fVar167 = fVar167 + fVar167 * auVar15._24_4_;
  auVar15 = vrcpps_avx(auVar14);
  fVar195 = auVar15._0_4_;
  fVar212 = auVar15._4_4_;
  auVar17._4_4_ = fVar212 * auVar14._4_4_;
  auVar17._0_4_ = fVar195 * auVar14._0_4_;
  fVar213 = auVar15._8_4_;
  auVar17._8_4_ = fVar213 * auVar14._8_4_;
  fVar214 = auVar15._12_4_;
  auVar17._12_4_ = fVar214 * auVar14._12_4_;
  fVar215 = auVar15._16_4_;
  auVar17._16_4_ = fVar215 * auVar14._16_4_;
  fVar216 = auVar15._20_4_;
  auVar17._20_4_ = fVar216 * auVar14._20_4_;
  fVar217 = auVar15._24_4_;
  auVar17._24_4_ = fVar217 * auVar14._24_4_;
  auVar17._28_4_ = auVar13._28_4_;
  auVar13 = vsubps_avx(auVar261,auVar17);
  fVar195 = fVar195 + fVar195 * auVar13._0_4_;
  fVar212 = fVar212 + fVar212 * auVar13._4_4_;
  fVar213 = fVar213 + fVar213 * auVar13._8_4_;
  fVar214 = fVar214 + fVar214 * auVar13._12_4_;
  fVar215 = fVar215 + fVar215 * auVar13._16_4_;
  fVar216 = fVar216 + fVar216 * auVar13._20_4_;
  fVar217 = fVar217 + fVar217 * auVar13._24_4_;
  auVar13 = vrcpps_avx(auVar93);
  fVar218 = auVar13._0_4_;
  fVar228 = auVar13._4_4_;
  auVar14._4_4_ = fVar228 * auVar93._4_4_;
  auVar14._0_4_ = fVar218 * auVar93._0_4_;
  fVar229 = auVar13._8_4_;
  auVar14._8_4_ = fVar229 * auVar93._8_4_;
  fVar230 = auVar13._12_4_;
  auVar14._12_4_ = fVar230 * auVar93._12_4_;
  fVar231 = auVar13._16_4_;
  auVar14._16_4_ = fVar231 * auVar93._16_4_;
  fVar233 = auVar13._20_4_;
  auVar14._20_4_ = fVar233 * auVar93._20_4_;
  fVar234 = auVar13._24_4_;
  auVar14._24_4_ = fVar234 * auVar93._24_4_;
  auVar14._28_4_ = auVar93._28_4_;
  auVar93 = vsubps_avx(auVar261,auVar14);
  fVar218 = fVar218 + fVar218 * auVar93._0_4_;
  fVar228 = fVar228 + fVar228 * auVar93._4_4_;
  fVar229 = fVar229 + fVar229 * auVar93._8_4_;
  fVar230 = fVar230 + fVar230 * auVar93._12_4_;
  fVar231 = fVar231 + fVar231 * auVar93._16_4_;
  fVar233 = fVar233 + fVar233 * auVar93._20_4_;
  fVar234 = fVar234 + fVar234 * auVar93._24_4_;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar66 * 7 + 6);
  auVar82 = vpmovsxwd_avx(auVar82);
  auVar253._8_8_ = 0;
  auVar253._0_8_ = *(ulong *)(prim + uVar66 * 7 + 0xe);
  auVar253 = vpmovsxwd_avx(auVar253);
  auVar95._16_16_ = auVar253;
  auVar95._0_16_ = auVar82;
  auVar93 = vcvtdq2ps_avx(auVar95);
  auVar93 = vsubps_avx(auVar93,auVar126);
  auVar154._8_8_ = 0;
  auVar154._0_8_ = *(ulong *)(prim + uVar66 * 9 + 6);
  auVar82 = vpmovsxwd_avx(auVar154);
  auVar121._8_8_ = 0;
  auVar121._0_8_ = *(ulong *)(prim + uVar66 * 9 + 0xe);
  auVar253 = vpmovsxwd_avx(auVar121);
  auVar74._0_4_ = fVar134 * auVar93._0_4_;
  auVar74._4_4_ = fVar162 * auVar93._4_4_;
  auVar74._8_4_ = fVar163 * auVar93._8_4_;
  auVar74._12_4_ = fVar164 * auVar93._12_4_;
  auVar15._16_4_ = fVar165 * auVar93._16_4_;
  auVar15._0_16_ = auVar74;
  auVar15._20_4_ = fVar166 * auVar93._20_4_;
  auVar15._24_4_ = fVar167 * auVar93._24_4_;
  auVar15._28_4_ = auVar93._28_4_;
  auVar244._16_16_ = auVar253;
  auVar244._0_16_ = auVar82;
  auVar93 = vcvtdq2ps_avx(auVar244);
  auVar93 = vsubps_avx(auVar93,auVar126);
  auVar105._0_4_ = fVar134 * auVar93._0_4_;
  auVar105._4_4_ = fVar162 * auVar93._4_4_;
  auVar105._8_4_ = fVar163 * auVar93._8_4_;
  auVar105._12_4_ = fVar164 * auVar93._12_4_;
  auVar18._16_4_ = fVar165 * auVar93._16_4_;
  auVar18._0_16_ = auVar105;
  auVar18._20_4_ = fVar166 * auVar93._20_4_;
  auVar18._24_4_ = fVar167 * auVar93._24_4_;
  auVar18._28_4_ = auVar93._28_4_;
  auVar109._8_8_ = 0;
  auVar109._0_8_ = *(ulong *)(prim + uVar66 * 0xe + 6);
  auVar82 = vpmovsxwd_avx(auVar109);
  auVar140._8_8_ = 0;
  auVar140._0_8_ = *(ulong *)(prim + uVar66 * 0xe + 0xe);
  auVar253 = vpmovsxwd_avx(auVar140);
  auVar158._16_16_ = auVar253;
  auVar158._0_16_ = auVar82;
  auVar93 = vcvtdq2ps_avx(auVar158);
  auVar93 = vsubps_avx(auVar93,auVar192);
  auVar135._0_4_ = fVar195 * auVar93._0_4_;
  auVar135._4_4_ = fVar212 * auVar93._4_4_;
  auVar135._8_4_ = fVar213 * auVar93._8_4_;
  auVar135._12_4_ = fVar214 * auVar93._12_4_;
  auVar19._16_4_ = fVar215 * auVar93._16_4_;
  auVar19._0_16_ = auVar135;
  auVar19._20_4_ = fVar216 * auVar93._20_4_;
  auVar19._24_4_ = fVar217 * auVar93._24_4_;
  auVar19._28_4_ = auVar93._28_4_;
  auVar110._8_8_ = 0;
  auVar110._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar7 * 0x10 + 6);
  auVar82 = vpmovsxwd_avx(auVar110);
  auVar232._8_8_ = 0;
  auVar232._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar7 * 0x10 + 0xe);
  auVar253 = vpmovsxwd_avx(auVar232);
  auVar245._16_16_ = auVar253;
  auVar245._0_16_ = auVar82;
  auVar93 = vcvtdq2ps_avx(auVar245);
  auVar93 = vsubps_avx(auVar93,auVar192);
  auVar180._0_4_ = fVar195 * auVar93._0_4_;
  auVar180._4_4_ = fVar212 * auVar93._4_4_;
  auVar180._8_4_ = fVar213 * auVar93._8_4_;
  auVar180._12_4_ = fVar214 * auVar93._12_4_;
  auVar20._16_4_ = fVar215 * auVar93._16_4_;
  auVar20._0_16_ = auVar180;
  auVar20._20_4_ = fVar216 * auVar93._20_4_;
  auVar20._24_4_ = fVar217 * auVar93._24_4_;
  auVar20._28_4_ = auVar93._28_4_;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar66 * 0x15 + 6);
  auVar82 = vpmovsxwd_avx(auVar5);
  auVar254._8_8_ = 0;
  auVar254._0_8_ = *(ulong *)(prim + uVar66 * 0x15 + 0xe);
  auVar253 = vpmovsxwd_avx(auVar254);
  auVar209._16_16_ = auVar253;
  auVar209._0_16_ = auVar82;
  auVar93 = vcvtdq2ps_avx(auVar209);
  auVar93 = vsubps_avx(auVar93,auVar178);
  auVar197._0_4_ = fVar218 * auVar93._0_4_;
  auVar197._4_4_ = fVar228 * auVar93._4_4_;
  auVar197._8_4_ = fVar229 * auVar93._8_4_;
  auVar197._12_4_ = fVar230 * auVar93._12_4_;
  auVar21._16_4_ = fVar231 * auVar93._16_4_;
  auVar21._0_16_ = auVar197;
  auVar21._20_4_ = fVar233 * auVar93._20_4_;
  auVar21._24_4_ = fVar234 * auVar93._24_4_;
  auVar21._28_4_ = auVar93._28_4_;
  auVar313._8_8_ = 0;
  auVar313._0_8_ = *(ulong *)(prim + uVar66 * 0x17 + 6);
  auVar82 = vpmovsxwd_avx(auVar313);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar66 * 0x17 + 0xe);
  auVar253 = vpmovsxwd_avx(auVar6);
  auVar246._16_16_ = auVar253;
  auVar246._0_16_ = auVar82;
  auVar93 = vcvtdq2ps_avx(auVar246);
  auVar93 = vsubps_avx(auVar93,auVar178);
  auVar168._0_4_ = fVar218 * auVar93._0_4_;
  auVar168._4_4_ = fVar228 * auVar93._4_4_;
  auVar168._8_4_ = fVar229 * auVar93._8_4_;
  auVar168._12_4_ = fVar230 * auVar93._12_4_;
  auVar22._16_4_ = fVar231 * auVar93._16_4_;
  auVar22._0_16_ = auVar168;
  auVar22._20_4_ = fVar233 * auVar93._20_4_;
  auVar22._24_4_ = fVar234 * auVar93._24_4_;
  auVar22._28_4_ = auVar93._28_4_;
  auVar82 = vpminsd_avx(auVar15._16_16_,auVar18._16_16_);
  auVar253 = vpminsd_avx(auVar74,auVar105);
  auVar289._16_16_ = auVar82;
  auVar289._0_16_ = auVar253;
  auVar82 = vpminsd_avx(auVar19._16_16_,auVar20._16_16_);
  auVar253 = vpminsd_avx(auVar135,auVar180);
  auVar298._16_16_ = auVar82;
  auVar298._0_16_ = auVar253;
  auVar93 = vmaxps_avx(auVar289,auVar298);
  auVar82 = vpminsd_avx(auVar21._16_16_,auVar22._16_16_);
  auVar253 = vpminsd_avx(auVar197,auVar168);
  auVar316._16_16_ = auVar82;
  auVar316._0_16_ = auVar253;
  uVar73 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar323._4_4_ = uVar73;
  auVar323._0_4_ = uVar73;
  auVar323._8_4_ = uVar73;
  auVar323._12_4_ = uVar73;
  auVar323._16_4_ = uVar73;
  auVar323._20_4_ = uVar73;
  auVar323._24_4_ = uVar73;
  auVar323._28_4_ = uVar73;
  auVar13 = vmaxps_avx(auVar316,auVar323);
  auVar93 = vmaxps_avx(auVar93,auVar13);
  local_1b8._4_4_ = auVar93._4_4_ * 0.99999964;
  local_1b8._0_4_ = auVar93._0_4_ * 0.99999964;
  local_1b8._8_4_ = auVar93._8_4_ * 0.99999964;
  local_1b8._12_4_ = auVar93._12_4_ * 0.99999964;
  local_1b8._16_4_ = auVar93._16_4_ * 0.99999964;
  local_1b8._20_4_ = auVar93._20_4_ * 0.99999964;
  local_1b8._24_4_ = auVar93._24_4_ * 0.99999964;
  local_1b8._28_4_ = auVar93._28_4_;
  auVar82 = vpmaxsd_avx(auVar15._16_16_,auVar18._16_16_);
  auVar253 = vpmaxsd_avx(auVar74,auVar105);
  auVar96._16_16_ = auVar82;
  auVar96._0_16_ = auVar253;
  auVar82 = vpmaxsd_avx(auVar19._16_16_,auVar20._16_16_);
  auVar253 = vpmaxsd_avx(auVar135,auVar180);
  auVar127._16_16_ = auVar82;
  auVar127._0_16_ = auVar253;
  auVar93 = vminps_avx(auVar96,auVar127);
  auVar82 = vpmaxsd_avx(auVar21._16_16_,auVar22._16_16_);
  auVar253 = vpmaxsd_avx(auVar197,auVar168);
  auVar128._16_16_ = auVar82;
  auVar128._0_16_ = auVar253;
  fVar134 = ray->tfar;
  auVar159._4_4_ = fVar134;
  auVar159._0_4_ = fVar134;
  auVar159._8_4_ = fVar134;
  auVar159._12_4_ = fVar134;
  auVar159._16_4_ = fVar134;
  auVar159._20_4_ = fVar134;
  auVar159._24_4_ = fVar134;
  auVar159._28_4_ = fVar134;
  auVar13 = vminps_avx(auVar128,auVar159);
  auVar93 = vminps_avx(auVar93,auVar13);
  auVar13._4_4_ = auVar93._4_4_ * 1.0000004;
  auVar13._0_4_ = auVar93._0_4_ * 1.0000004;
  auVar13._8_4_ = auVar93._8_4_ * 1.0000004;
  auVar13._12_4_ = auVar93._12_4_ * 1.0000004;
  auVar13._16_4_ = auVar93._16_4_ * 1.0000004;
  auVar13._20_4_ = auVar93._20_4_ * 1.0000004;
  auVar13._24_4_ = auVar93._24_4_ * 1.0000004;
  auVar13._28_4_ = auVar93._28_4_;
  auVar93 = vcmpps_avx(local_1b8,auVar13,2);
  auVar82 = vpshufd_avx(ZEXT116((byte)PVar7),0);
  auVar129._16_16_ = auVar82;
  auVar129._0_16_ = auVar82;
  auVar13 = vcvtdq2ps_avx(auVar129);
  auVar13 = vcmpps_avx(_DAT_01f7b060,auVar13,1);
  auVar93 = vandps_avx(auVar93,auVar13);
  uVar73 = vmovmskps_avx(auVar93);
  uVar66 = CONCAT44((int)((ulong)unaff_R14 >> 0x20),uVar73);
  auVar97._16_16_ = mm_lookupmask_ps._240_16_;
  auVar97._0_16_ = mm_lookupmask_ps._240_16_;
  local_198 = vblendps_avx(auVar97,ZEXT832(0) << 0x20,0x80);
LAB_00a21062:
  if (uVar66 == 0) {
LAB_00a22e31:
    return uVar66 != 0;
  }
  lVar67 = 0;
  if (uVar66 != 0) {
    for (; (uVar66 >> lVar67 & 1) == 0; lVar67 = lVar67 + 1) {
    }
  }
  local_480 = (ulong)*(uint *)(prim + 2);
  local_310 = (ulong)*(uint *)(prim + lVar67 * 4 + 6);
  pGVar8 = (context->scene->geometries).items[local_480].ptr;
  uVar71 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_310);
  p_Var9 = pGVar8[1].intersectionFilterN;
  pvVar10 = pGVar8[2].userPtr;
  _Var11 = pGVar8[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar1 = (float *)(_Var11 + uVar71 * (long)pvVar10);
  fVar134 = *pfVar1;
  fVar162 = pfVar1[1];
  fVar163 = pfVar1[2];
  fVar164 = pfVar1[3];
  pfVar1 = (float *)(_Var11 + (uVar71 + 1) * (long)pvVar10);
  fVar165 = *pfVar1;
  fVar166 = pfVar1[1];
  fVar167 = pfVar1[2];
  fVar195 = pfVar1[3];
  auVar253 = *(undefined1 (*) [16])(_Var11 + (uVar71 + 2) * (long)pvVar10);
  pfVar1 = (float *)(_Var11 + (long)pvVar10 * (uVar71 + 3));
  fVar212 = *pfVar1;
  fVar213 = pfVar1[1];
  fVar214 = pfVar1[2];
  fVar215 = pfVar1[3];
  lVar67 = *(long *)&pGVar8[1].time_range.upper;
  pfVar1 = (float *)(lVar67 + (long)p_Var9 * uVar71);
  fVar216 = *pfVar1;
  fVar217 = pfVar1[1];
  fVar218 = pfVar1[2];
  fVar228 = pfVar1[3];
  auVar82 = *(undefined1 (*) [16])(lVar67 + (long)p_Var9 * (uVar71 + 1));
  uVar70 = uVar66 - 1 & uVar66;
  pfVar1 = (float *)(lVar67 + (long)p_Var9 * (uVar71 + 2));
  fVar229 = *pfVar1;
  fVar230 = pfVar1[1];
  fVar231 = pfVar1[2];
  fVar233 = pfVar1[3];
  lVar12 = 0;
  if (uVar70 != 0) {
    for (; (uVar70 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
    }
  }
  pfVar1 = (float *)(lVar67 + (long)p_Var9 * (uVar71 + 3));
  fVar234 = *pfVar1;
  fVar301 = pfVar1[1];
  fVar264 = pfVar1[2];
  fVar305 = pfVar1[3];
  if (((uVar70 != 0) && (uVar71 = uVar70 - 1 & uVar70, uVar71 != 0)) && (lVar67 = 0, uVar71 != 0)) {
    for (; (uVar71 >> lVar67 & 1) == 0; lVar67 = lVar67 + 1) {
    }
  }
  fVar306 = auVar82._0_4_;
  fVar266 = auVar82._4_4_;
  fVar307 = auVar82._8_4_;
  fVar265 = auVar82._12_4_;
  auVar75._0_4_ = fVar306 * 0.0 + fVar229 * 0.5 + fVar234 * 0.0;
  auVar75._4_4_ = fVar266 * 0.0 + fVar230 * 0.5 + fVar301 * 0.0;
  auVar75._8_4_ = fVar307 * 0.0 + fVar231 * 0.5 + fVar264 * 0.0;
  auVar75._12_4_ = fVar265 * 0.0 + fVar233 * 0.5 + fVar305 * 0.0;
  auVar292._0_4_ = fVar216 * 0.5;
  auVar292._4_4_ = fVar217 * 0.5;
  auVar292._8_4_ = fVar218 * 0.5;
  auVar292._12_4_ = fVar228 * 0.5;
  auVar232 = vsubps_avx(auVar75,auVar292);
  local_4a8._0_4_ = auVar253._0_4_;
  local_4a8._4_4_ = auVar253._4_4_;
  fStack_4a0 = auVar253._8_4_;
  fStack_49c = auVar253._12_4_;
  auVar293._0_4_ = fVar165 * 0.0 + (float)local_4a8._0_4_ * 0.5 + fVar212 * 0.0;
  auVar293._4_4_ = fVar166 * 0.0 + (float)local_4a8._4_4_ * 0.5 + fVar213 * 0.0;
  auVar293._8_4_ = fVar167 * 0.0 + fStack_4a0 * 0.5 + fVar214 * 0.0;
  auVar293._12_4_ = fVar195 * 0.0 + fStack_49c * 0.5 + fVar215 * 0.0;
  auVar325._0_4_ = fVar134 * 0.5;
  auVar325._4_4_ = fVar162 * 0.5;
  auVar325._8_4_ = fVar163 * 0.5;
  auVar325._12_4_ = fVar164 * 0.5;
  auVar121 = vsubps_avx(auVar293,auVar325);
  local_508._0_4_ = fVar216 * -0.0 + fVar306 + fVar229 * 0.0 + fVar234 * -0.0;
  local_508._4_4_ = fVar217 * -0.0 + fVar266 + fVar230 * 0.0 + fVar301 * -0.0;
  fStack_500 = fVar218 * -0.0 + fVar307 + fVar231 * 0.0 + fVar264 * -0.0;
  fStack_4fc = fVar228 * -0.0 + fVar265 + fVar233 * 0.0 + fVar305 * -0.0;
  local_4c8._0_4_ = fVar216 * -0.0 + fVar306 * 0.0 + fVar234 * -0.0 + fVar229;
  local_4c8._4_4_ = fVar217 * -0.0 + fVar266 * 0.0 + fVar301 * -0.0 + fVar230;
  fStack_4c0 = fVar218 * -0.0 + fVar307 * 0.0 + fVar264 * -0.0 + fVar231;
  fStack_4bc = fVar228 * -0.0 + fVar265 * 0.0 + fVar305 * -0.0 + fVar233;
  auVar268._0_4_ = fVar229 * 0.0 + fVar234 * 0.5;
  auVar268._4_4_ = fVar230 * 0.0 + fVar301 * 0.5;
  auVar268._8_4_ = fVar231 * 0.0 + fVar264 * 0.5;
  auVar268._12_4_ = fVar233 * 0.0 + fVar305 * 0.5;
  auVar326._0_4_ = fVar134 * -0.0 + fVar165 + (float)local_4a8._0_4_ * 0.0 + fVar212 * -0.0;
  auVar326._4_4_ = fVar162 * -0.0 + fVar166 + (float)local_4a8._4_4_ * 0.0 + fVar213 * -0.0;
  auVar326._8_4_ = fVar163 * -0.0 + fVar167 + fStack_4a0 * 0.0 + fVar214 * -0.0;
  auVar326._12_4_ = fVar164 * -0.0 + fVar195 + fStack_49c * 0.0 + fVar215 * -0.0;
  auVar249._0_4_ = fVar306 * 0.5;
  auVar249._4_4_ = fVar266 * 0.5;
  auVar249._8_4_ = fVar307 * 0.5;
  auVar249._12_4_ = fVar265 * 0.5;
  auVar82 = vsubps_avx(auVar268,auVar249);
  auVar181._0_4_ = auVar82._0_4_ + fVar216 * 0.0;
  auVar181._4_4_ = auVar82._4_4_ + fVar217 * 0.0;
  auVar181._8_4_ = auVar82._8_4_ + fVar218 * 0.0;
  auVar181._12_4_ = auVar82._12_4_ + fVar228 * 0.0;
  auVar250._0_4_ = fVar134 * -0.0 + fVar165 * 0.0 + fVar212 * -0.0 + (float)local_4a8._0_4_;
  auVar250._4_4_ = fVar162 * -0.0 + fVar166 * 0.0 + fVar213 * -0.0 + (float)local_4a8._4_4_;
  auVar250._8_4_ = fVar163 * -0.0 + fVar167 * 0.0 + fVar214 * -0.0 + fStack_4a0;
  auVar250._12_4_ = fVar164 * -0.0 + fVar195 * 0.0 + fVar215 * -0.0 + fStack_49c;
  auVar219._0_4_ = (float)local_4a8._0_4_ * 0.0 + fVar212 * 0.5;
  auVar219._4_4_ = (float)local_4a8._4_4_ * 0.0 + fVar213 * 0.5;
  auVar219._8_4_ = fStack_4a0 * 0.0 + fVar214 * 0.5;
  auVar219._12_4_ = fStack_49c * 0.0 + fVar215 * 0.5;
  auVar198._0_4_ = fVar165 * 0.5;
  auVar198._4_4_ = fVar166 * 0.5;
  auVar198._8_4_ = fVar167 * 0.5;
  auVar198._12_4_ = fVar195 * 0.5;
  auVar82 = vsubps_avx(auVar219,auVar198);
  auVar199._0_4_ = fVar134 * 0.0 + auVar82._0_4_;
  auVar199._4_4_ = fVar162 * 0.0 + auVar82._4_4_;
  auVar199._8_4_ = fVar163 * 0.0 + auVar82._8_4_;
  auVar199._12_4_ = fVar164 * 0.0 + auVar82._12_4_;
  auVar82 = vshufps_avx(auVar232,auVar232,0xc9);
  auVar253 = vshufps_avx(auVar326,auVar326,0xc9);
  fVar216 = auVar232._0_4_;
  auVar220._0_4_ = fVar216 * auVar253._0_4_;
  fVar217 = auVar232._4_4_;
  auVar220._4_4_ = fVar217 * auVar253._4_4_;
  fVar218 = auVar232._8_4_;
  auVar220._8_4_ = fVar218 * auVar253._8_4_;
  fVar228 = auVar232._12_4_;
  auVar220._12_4_ = fVar228 * auVar253._12_4_;
  auVar235._0_4_ = auVar326._0_4_ * auVar82._0_4_;
  auVar235._4_4_ = auVar326._4_4_ * auVar82._4_4_;
  auVar235._8_4_ = auVar326._8_4_ * auVar82._8_4_;
  auVar235._12_4_ = auVar326._12_4_ * auVar82._12_4_;
  auVar253 = vsubps_avx(auVar235,auVar220);
  auVar154 = vshufps_avx(auVar253,auVar253,0xc9);
  auVar253 = vshufps_avx(auVar121,auVar121,0xc9);
  auVar221._0_4_ = fVar216 * auVar253._0_4_;
  auVar221._4_4_ = fVar217 * auVar253._4_4_;
  auVar221._8_4_ = fVar218 * auVar253._8_4_;
  auVar221._12_4_ = fVar228 * auVar253._12_4_;
  auVar169._0_4_ = auVar121._0_4_ * auVar82._0_4_;
  auVar169._4_4_ = auVar121._4_4_ * auVar82._4_4_;
  auVar169._8_4_ = auVar121._8_4_ * auVar82._8_4_;
  auVar169._12_4_ = auVar121._12_4_ * auVar82._12_4_;
  auVar82 = vsubps_avx(auVar169,auVar221);
  auVar121 = vshufps_avx(auVar82,auVar82,0xc9);
  auVar82 = vshufps_avx(auVar181,auVar181,0xc9);
  auVar253 = vshufps_avx(auVar250,auVar250,0xc9);
  auVar170._0_4_ = auVar181._0_4_ * auVar253._0_4_;
  auVar170._4_4_ = auVar181._4_4_ * auVar253._4_4_;
  auVar170._8_4_ = auVar181._8_4_ * auVar253._8_4_;
  auVar170._12_4_ = auVar181._12_4_ * auVar253._12_4_;
  auVar251._0_4_ = auVar250._0_4_ * auVar82._0_4_;
  auVar251._4_4_ = auVar250._4_4_ * auVar82._4_4_;
  auVar251._8_4_ = auVar250._8_4_ * auVar82._8_4_;
  auVar251._12_4_ = auVar250._12_4_ * auVar82._12_4_;
  auVar253 = vsubps_avx(auVar251,auVar170);
  auVar109 = vshufps_avx(auVar253,auVar253,0xc9);
  auVar253 = vshufps_avx(auVar199,auVar199,0xc9);
  auVar252._0_4_ = auVar253._0_4_ * auVar181._0_4_;
  auVar252._4_4_ = auVar253._4_4_ * auVar181._4_4_;
  auVar252._8_4_ = auVar253._8_4_ * auVar181._8_4_;
  auVar252._12_4_ = auVar253._12_4_ * auVar181._12_4_;
  auVar200._0_4_ = auVar82._0_4_ * auVar199._0_4_;
  auVar200._4_4_ = auVar82._4_4_ * auVar199._4_4_;
  auVar200._8_4_ = auVar82._8_4_ * auVar199._8_4_;
  auVar200._12_4_ = auVar82._12_4_ * auVar199._12_4_;
  auVar253 = vsubps_avx(auVar200,auVar252);
  auVar82 = vdpps_avx(auVar154,auVar154,0x7f);
  auVar140 = vshufps_avx(auVar253,auVar253,0xc9);
  fVar165 = auVar82._0_4_;
  auVar254 = ZEXT416((uint)fVar165);
  auVar253 = vrsqrtss_avx(auVar254,auVar254);
  fVar134 = auVar253._0_4_;
  auVar253 = vdpps_avx(auVar154,auVar121,0x7f);
  auVar110 = ZEXT416((uint)(fVar134 * 1.5 - fVar165 * 0.5 * fVar134 * fVar134 * fVar134));
  auVar110 = vshufps_avx(auVar110,auVar110,0);
  fVar134 = auVar110._0_4_ * auVar154._0_4_;
  fVar162 = auVar110._4_4_ * auVar154._4_4_;
  fVar163 = auVar110._8_4_ * auVar154._8_4_;
  fVar164 = auVar110._12_4_ * auVar154._12_4_;
  auVar82 = vshufps_avx(auVar82,auVar82,0);
  auVar269._0_4_ = auVar121._0_4_ * auVar82._0_4_;
  auVar269._4_4_ = auVar121._4_4_ * auVar82._4_4_;
  auVar269._8_4_ = auVar121._8_4_ * auVar82._8_4_;
  auVar269._12_4_ = auVar121._12_4_ * auVar82._12_4_;
  auVar82 = vshufps_avx(auVar253,auVar253,0);
  auVar236._0_4_ = auVar82._0_4_ * auVar154._0_4_;
  auVar236._4_4_ = auVar82._4_4_ * auVar154._4_4_;
  auVar236._8_4_ = auVar82._8_4_ * auVar154._8_4_;
  auVar236._12_4_ = auVar82._12_4_ * auVar154._12_4_;
  auVar5 = vsubps_avx(auVar269,auVar236);
  auVar253 = vrcpss_avx(auVar254,auVar254);
  auVar82 = vdpps_avx(auVar109,auVar109,0x7f);
  auVar253 = ZEXT416((uint)(auVar253._0_4_ * (2.0 - fVar165 * auVar253._0_4_)));
  auVar154 = vshufps_avx(auVar253,auVar253,0);
  fVar165 = auVar82._0_4_;
  auVar254 = ZEXT416((uint)fVar165);
  auVar253 = vrsqrtss_avx(auVar254,auVar254);
  fVar166 = auVar253._0_4_;
  auVar253 = ZEXT416((uint)(fVar166 * 1.5 - fVar165 * 0.5 * fVar166 * fVar166 * fVar166));
  auVar121 = vshufps_avx(auVar253,auVar253,0);
  auVar253 = vdpps_avx(auVar109,auVar140,0x7f);
  fVar166 = auVar121._0_4_ * auVar109._0_4_;
  fVar167 = auVar121._4_4_ * auVar109._4_4_;
  fVar195 = auVar121._8_4_ * auVar109._8_4_;
  fVar212 = auVar121._12_4_ * auVar109._12_4_;
  auVar82 = vshufps_avx(auVar82,auVar82,0);
  auVar222._0_4_ = auVar82._0_4_ * auVar140._0_4_;
  auVar222._4_4_ = auVar82._4_4_ * auVar140._4_4_;
  auVar222._8_4_ = auVar82._8_4_ * auVar140._8_4_;
  auVar222._12_4_ = auVar82._12_4_ * auVar140._12_4_;
  auVar82 = vshufps_avx(auVar253,auVar253,0);
  auVar171._0_4_ = auVar82._0_4_ * auVar109._0_4_;
  auVar171._4_4_ = auVar82._4_4_ * auVar109._4_4_;
  auVar171._8_4_ = auVar82._8_4_ * auVar109._8_4_;
  auVar171._12_4_ = auVar82._12_4_ * auVar109._12_4_;
  auVar140 = vsubps_avx(auVar222,auVar171);
  auVar82 = vrcpss_avx(auVar254,auVar254);
  auVar82 = ZEXT416((uint)((2.0 - fVar165 * auVar82._0_4_) * auVar82._0_4_));
  auVar82 = vshufps_avx(auVar82,auVar82,0);
  auVar253 = vshufps_avx(_local_508,_local_508,0xff);
  auVar255._0_4_ = auVar253._0_4_ * fVar134;
  auVar255._4_4_ = auVar253._4_4_ * fVar162;
  auVar255._8_4_ = auVar253._8_4_ * fVar163;
  auVar255._12_4_ = auVar253._12_4_ * fVar164;
  _local_3d8 = vsubps_avx(_local_508,auVar255);
  auVar109 = vshufps_avx(auVar232,auVar232,0xff);
  auVar201._0_4_ =
       auVar109._0_4_ * fVar134 + auVar253._0_4_ * auVar110._0_4_ * auVar154._0_4_ * auVar5._0_4_;
  auVar201._4_4_ =
       auVar109._4_4_ * fVar162 + auVar253._4_4_ * auVar110._4_4_ * auVar154._4_4_ * auVar5._4_4_;
  auVar201._8_4_ =
       auVar109._8_4_ * fVar163 + auVar253._8_4_ * auVar110._8_4_ * auVar154._8_4_ * auVar5._8_4_;
  auVar201._12_4_ =
       auVar109._12_4_ * fVar164 +
       auVar253._12_4_ * auVar110._12_4_ * auVar154._12_4_ * auVar5._12_4_;
  auVar109 = vsubps_avx(auVar232,auVar201);
  local_3e8._0_4_ = auVar255._0_4_ + (float)local_508._0_4_;
  local_3e8._4_4_ = auVar255._4_4_ + (float)local_508._4_4_;
  fStack_3e0 = auVar255._8_4_ + fStack_500;
  fStack_3dc = auVar255._12_4_ + fStack_4fc;
  auVar253 = vshufps_avx(_local_4c8,_local_4c8,0xff);
  auVar136._0_4_ = fVar166 * auVar253._0_4_;
  auVar136._4_4_ = fVar167 * auVar253._4_4_;
  auVar136._8_4_ = fVar195 * auVar253._8_4_;
  auVar136._12_4_ = fVar212 * auVar253._12_4_;
  _local_3f8 = vsubps_avx(_local_4c8,auVar136);
  auVar154 = vshufps_avx(auVar181,auVar181,0xff);
  auVar76._0_4_ =
       fVar166 * auVar154._0_4_ + auVar253._0_4_ * auVar121._0_4_ * auVar140._0_4_ * auVar82._0_4_;
  auVar76._4_4_ =
       fVar167 * auVar154._4_4_ + auVar253._4_4_ * auVar121._4_4_ * auVar140._4_4_ * auVar82._4_4_;
  auVar76._8_4_ =
       fVar195 * auVar154._8_4_ + auVar253._8_4_ * auVar121._8_4_ * auVar140._8_4_ * auVar82._8_4_;
  auVar76._12_4_ =
       fVar212 * auVar154._12_4_ +
       auVar253._12_4_ * auVar121._12_4_ * auVar140._12_4_ * auVar82._12_4_;
  auVar82 = vsubps_avx(auVar181,auVar76);
  local_478 = (float)local_4c8._0_4_ + auVar136._0_4_;
  fStack_474 = (float)local_4c8._4_4_ + auVar136._4_4_;
  fStack_470 = fStack_4c0 + auVar136._8_4_;
  fStack_46c = fStack_4bc + auVar136._12_4_;
  local_408._0_4_ = local_3d8._0_4_ + auVar109._0_4_ * 0.33333334;
  local_408._4_4_ = local_3d8._4_4_ + auVar109._4_4_ * 0.33333334;
  fStack_400 = local_3d8._8_4_ + auVar109._8_4_ * 0.33333334;
  fStack_3fc = local_3d8._12_4_ + auVar109._12_4_ * 0.33333334;
  auVar77._0_4_ = auVar82._0_4_ * 0.33333334;
  auVar77._4_4_ = auVar82._4_4_ * 0.33333334;
  auVar77._8_4_ = auVar82._8_4_ * 0.33333334;
  auVar77._12_4_ = auVar82._12_4_ * 0.33333334;
  _local_418 = vsubps_avx(_local_3f8,auVar77);
  aVar4 = (ray->org).field_0;
  auVar154 = vsubps_avx(_local_3d8,(undefined1  [16])aVar4);
  auVar253 = vmovsldup_avx(auVar154);
  auVar82 = vmovshdup_avx(auVar154);
  auVar154 = vshufps_avx(auVar154,auVar154,0xaa);
  fVar134 = (pre->ray_space).vx.field_0.m128[0];
  fVar162 = (pre->ray_space).vx.field_0.m128[1];
  fVar163 = (pre->ray_space).vx.field_0.m128[2];
  fVar164 = (pre->ray_space).vx.field_0.m128[3];
  fVar165 = (pre->ray_space).vy.field_0.m128[0];
  fVar166 = (pre->ray_space).vy.field_0.m128[1];
  fVar167 = (pre->ray_space).vy.field_0.m128[2];
  fVar195 = (pre->ray_space).vy.field_0.m128[3];
  fVar212 = (pre->ray_space).vz.field_0.m128[0];
  fVar213 = (pre->ray_space).vz.field_0.m128[1];
  fVar214 = (pre->ray_space).vz.field_0.m128[2];
  fVar215 = (pre->ray_space).vz.field_0.m128[3];
  local_508._4_4_ = fVar162 * auVar253._4_4_ + fVar166 * auVar82._4_4_ + fVar213 * auVar154._4_4_;
  local_508._0_4_ = fVar134 * auVar253._0_4_ + fVar165 * auVar82._0_4_ + fVar212 * auVar154._0_4_;
  fStack_500 = fVar163 * auVar253._8_4_ + fVar167 * auVar82._8_4_ + fVar214 * auVar154._8_4_;
  fStack_4fc = fVar164 * auVar253._12_4_ + fVar195 * auVar82._12_4_ + fVar215 * auVar154._12_4_;
  auVar154 = vsubps_avx(_local_408,(undefined1  [16])aVar4);
  auVar253 = vmovsldup_avx(auVar154);
  auVar82 = vmovshdup_avx(auVar154);
  auVar154 = vshufps_avx(auVar154,auVar154,0xaa);
  auVar106._0_8_ =
       CONCAT44(fVar162 * auVar253._4_4_ + auVar82._4_4_ * fVar166 + fVar213 * auVar154._4_4_,
                fVar134 * auVar253._0_4_ + auVar82._0_4_ * fVar165 + fVar212 * auVar154._0_4_);
  auVar106._8_4_ = fVar163 * auVar253._8_4_ + auVar82._8_4_ * fVar167 + fVar214 * auVar154._8_4_;
  auVar106._12_4_ = fVar164 * auVar253._12_4_ + auVar82._12_4_ * fVar195 + fVar215 * auVar154._12_4_
  ;
  auVar253 = vsubps_avx(_local_418,(undefined1  [16])aVar4);
  auVar154 = vshufps_avx(auVar253,auVar253,0xaa);
  auVar82 = vmovshdup_avx(auVar253);
  auVar253 = vmovsldup_avx(auVar253);
  auVar327._0_8_ =
       CONCAT44(auVar82._4_4_ * fVar166 + auVar154._4_4_ * fVar213 + fVar162 * auVar253._4_4_,
                auVar82._0_4_ * fVar165 + auVar154._0_4_ * fVar212 + fVar134 * auVar253._0_4_);
  auVar327._8_4_ = auVar82._8_4_ * fVar167 + auVar154._8_4_ * fVar214 + fVar163 * auVar253._8_4_;
  auVar327._12_4_ = auVar82._12_4_ * fVar195 + auVar154._12_4_ * fVar215 + fVar164 * auVar253._12_4_
  ;
  auVar253 = vsubps_avx(_local_3f8,(undefined1  [16])aVar4);
  auVar154 = vshufps_avx(auVar253,auVar253,0xaa);
  auVar82 = vmovshdup_avx(auVar253);
  auVar253 = vmovsldup_avx(auVar253);
  auVar270._0_8_ =
       CONCAT44(auVar253._4_4_ * fVar162 + auVar82._4_4_ * fVar166 + auVar154._4_4_ * fVar213,
                auVar253._0_4_ * fVar134 + auVar82._0_4_ * fVar165 + auVar154._0_4_ * fVar212);
  auVar270._8_4_ = auVar253._8_4_ * fVar163 + auVar82._8_4_ * fVar167 + auVar154._8_4_ * fVar214;
  auVar270._12_4_ = auVar253._12_4_ * fVar164 + auVar82._12_4_ * fVar195 + auVar154._12_4_ * fVar215
  ;
  auVar253 = vsubps_avx(_local_3e8,(undefined1  [16])aVar4);
  auVar154 = vshufps_avx(auVar253,auVar253,0xaa);
  auVar82 = vmovshdup_avx(auVar253);
  auVar253 = vmovsldup_avx(auVar253);
  auVar283._0_8_ =
       CONCAT44(auVar253._4_4_ * fVar162 + auVar82._4_4_ * fVar166 + auVar154._4_4_ * fVar213,
                auVar253._0_4_ * fVar134 + auVar82._0_4_ * fVar165 + auVar154._0_4_ * fVar212);
  auVar283._8_4_ = auVar253._8_4_ * fVar163 + auVar82._8_4_ * fVar167 + auVar154._8_4_ * fVar214;
  auVar283._12_4_ = auVar253._12_4_ * fVar164 + auVar82._12_4_ * fVar195 + auVar154._12_4_ * fVar215
  ;
  local_428._0_4_ = (float)local_3e8._0_4_ + (fVar216 + auVar201._0_4_) * 0.33333334;
  local_428._4_4_ = (float)local_3e8._4_4_ + (fVar217 + auVar201._4_4_) * 0.33333334;
  fStack_420 = fStack_3e0 + (fVar218 + auVar201._8_4_) * 0.33333334;
  fStack_41c = fStack_3dc + (fVar228 + auVar201._12_4_) * 0.33333334;
  auVar253 = vsubps_avx(_local_428,(undefined1  [16])aVar4);
  auVar154 = vshufps_avx(auVar253,auVar253,0xaa);
  auVar82 = vmovshdup_avx(auVar253);
  auVar253 = vmovsldup_avx(auVar253);
  auVar256._0_8_ =
       CONCAT44(auVar253._4_4_ * fVar162 + auVar82._4_4_ * fVar166 + auVar154._4_4_ * fVar213,
                auVar253._0_4_ * fVar134 + auVar82._0_4_ * fVar165 + auVar154._0_4_ * fVar212);
  auVar256._8_4_ = auVar253._8_4_ * fVar163 + auVar82._8_4_ * fVar167 + auVar154._8_4_ * fVar214;
  auVar256._12_4_ = auVar253._12_4_ * fVar164 + auVar82._12_4_ * fVar195 + auVar154._12_4_ * fVar215
  ;
  auVar237._0_4_ = (auVar181._0_4_ + auVar76._0_4_) * 0.33333334;
  auVar237._4_4_ = (auVar181._4_4_ + auVar76._4_4_) * 0.33333334;
  auVar237._8_4_ = (auVar181._8_4_ + auVar76._8_4_) * 0.33333334;
  auVar237._12_4_ = (auVar181._12_4_ + auVar76._12_4_) * 0.33333334;
  auVar61._4_4_ = fStack_474;
  auVar61._0_4_ = local_478;
  auVar61._8_4_ = fStack_470;
  auVar61._12_4_ = fStack_46c;
  _local_2d8 = vsubps_avx(auVar61,auVar237);
  auVar253 = vsubps_avx(_local_2d8,(undefined1  [16])aVar4);
  auVar154 = vshufps_avx(auVar253,auVar253,0xaa);
  auVar82 = vmovshdup_avx(auVar253);
  auVar253 = vmovsldup_avx(auVar253);
  auVar238._0_8_ =
       CONCAT44(auVar82._4_4_ * fVar166 + auVar154._4_4_ * fVar213 + fVar162 * auVar253._4_4_,
                auVar82._0_4_ * fVar165 + auVar154._0_4_ * fVar212 + fVar134 * auVar253._0_4_);
  auVar238._8_4_ = auVar82._8_4_ * fVar167 + auVar154._8_4_ * fVar214 + fVar163 * auVar253._8_4_;
  auVar238._12_4_ = auVar82._12_4_ * fVar195 + auVar154._12_4_ * fVar215 + fVar164 * auVar253._12_4_
  ;
  auVar253 = vsubps_avx(auVar61,(undefined1  [16])aVar4);
  auVar154 = vshufps_avx(auVar253,auVar253,0xaa);
  auVar82 = vmovshdup_avx(auVar253);
  auVar253 = vmovsldup_avx(auVar253);
  auVar312._0_8_ =
       CONCAT44(fVar162 * auVar253._4_4_ + auVar82._4_4_ * fVar166 + auVar154._4_4_ * fVar213,
                fVar134 * auVar253._0_4_ + auVar82._0_4_ * fVar165 + auVar154._0_4_ * fVar212);
  auVar312._8_4_ = fVar163 * auVar253._8_4_ + auVar82._8_4_ * fVar167 + auVar154._8_4_ * fVar214;
  auVar312._12_4_ = fVar164 * auVar253._12_4_ + auVar82._12_4_ * fVar195 + auVar154._12_4_ * fVar215
  ;
  _local_4b8 = vmovlhps_avx(_local_508,auVar283);
  _local_4c8 = vmovlhps_avx(auVar106,auVar256);
  _local_328 = vmovlhps_avx(auVar327,auVar238);
  _local_218 = vmovlhps_avx(auVar270,auVar312);
  auVar82 = vminps_avx(_local_4b8,_local_4c8);
  auVar253 = vminps_avx(_local_328,_local_218);
  auVar154 = vminps_avx(auVar82,auVar253);
  auVar82 = vmaxps_avx(_local_4b8,_local_4c8);
  auVar253 = vmaxps_avx(_local_328,_local_218);
  auVar82 = vmaxps_avx(auVar82,auVar253);
  auVar253 = vshufpd_avx(auVar154,auVar154,3);
  auVar154 = vminps_avx(auVar154,auVar253);
  auVar253 = vshufpd_avx(auVar82,auVar82,3);
  auVar253 = vmaxps_avx(auVar82,auVar253);
  auVar223._8_4_ = 0x7fffffff;
  auVar223._0_8_ = 0x7fffffff7fffffff;
  auVar223._12_4_ = 0x7fffffff;
  auVar82 = vandps_avx(auVar154,auVar223);
  auVar253 = vandps_avx(auVar253,auVar223);
  auVar82 = vmaxps_avx(auVar82,auVar253);
  auVar253 = vmovshdup_avx(auVar82);
  auVar82 = vmaxss_avx(auVar253,auVar82);
  fVar134 = auVar82._0_4_ * 9.536743e-07;
  local_358._8_8_ = local_508;
  local_358._0_8_ = local_508;
  auVar227 = ZEXT1664(local_358);
  local_368._8_8_ = auVar106._0_8_;
  local_368._0_8_ = auVar106._0_8_;
  local_378._8_8_ = auVar327._0_8_;
  local_378._0_8_ = auVar327._0_8_;
  auVar330 = ZEXT1664(local_378);
  local_388._8_8_ = auVar270._0_8_;
  local_388._0_8_ = auVar270._0_8_;
  auVar276 = ZEXT1664(local_388);
  local_398._8_8_ = auVar283._0_8_;
  local_398._0_8_ = auVar283._0_8_;
  auVar291 = ZEXT1664(local_398);
  local_3a8._8_8_ = auVar256._0_8_;
  local_3a8._0_8_ = auVar256._0_8_;
  auVar263 = ZEXT1664(local_3a8);
  local_3b8._8_8_ = auVar238._0_8_;
  local_3b8._0_8_ = auVar238._0_8_;
  auVar248 = ZEXT1664(local_368);
  local_3c8._8_8_ = auVar312._0_8_;
  local_3c8._0_8_ = auVar312._0_8_;
  local_228 = ZEXT416((uint)fVar134);
  auVar82 = vshufps_avx(ZEXT416((uint)fVar134),ZEXT416((uint)fVar134),0);
  local_78._16_16_ = auVar82;
  local_78._0_16_ = auVar82;
  auVar78._0_8_ = auVar82._0_8_ ^ 0x8000000080000000;
  auVar78._8_4_ = auVar82._8_4_ ^ 0x80000000;
  auVar78._12_4_ = auVar82._12_4_ ^ 0x80000000;
  local_98._16_16_ = auVar78;
  local_98._0_16_ = auVar78;
  uVar72 = 0;
  uVar71 = 0;
  _local_1e8 = vsubps_avx(_local_4c8,_local_4b8);
  auVar300 = ZEXT1664(local_3b8);
  _local_1f8 = vsubps_avx(_local_328,_local_4c8);
  auVar304 = ZEXT1664(local_3c8);
  _local_208 = vsubps_avx(_local_218,_local_328);
  _local_258 = vsubps_avx(_local_3e8,_local_3d8);
  _local_268 = vsubps_avx(_local_428,_local_408);
  _local_278 = vsubps_avx(_local_2d8,_local_418);
  auVar62._4_4_ = fStack_474;
  auVar62._0_4_ = local_478;
  auVar62._8_4_ = fStack_470;
  auVar62._12_4_ = fStack_46c;
  _local_288 = vsubps_avx(auVar62,_local_3f8);
  _local_4f8 = ZEXT816(0x3f80000000000000);
  auVar317 = ZEXT1664(_local_4f8);
LAB_00a21851:
  auVar313 = auVar317._0_16_;
  auVar82 = vshufps_avx(auVar313,auVar313,0x50);
  auVar319._8_4_ = 0x3f800000;
  auVar319._0_8_ = 0x3f8000003f800000;
  auVar319._12_4_ = 0x3f800000;
  auVar324._16_4_ = 0x3f800000;
  auVar324._0_16_ = auVar319;
  auVar324._20_4_ = 0x3f800000;
  auVar324._24_4_ = 0x3f800000;
  auVar324._28_4_ = 0x3f800000;
  auVar253 = vsubps_avx(auVar319,auVar82);
  fVar134 = auVar82._0_4_;
  fVar162 = auVar82._4_4_;
  fVar163 = auVar82._8_4_;
  fVar164 = auVar82._12_4_;
  fVar165 = auVar253._0_4_;
  fVar166 = auVar253._4_4_;
  fVar167 = auVar253._8_4_;
  fVar195 = auVar253._12_4_;
  auVar172._0_4_ = auVar291._0_4_ * fVar134 + fVar165 * auVar227._0_4_;
  auVar172._4_4_ = auVar291._4_4_ * fVar162 + fVar166 * auVar227._4_4_;
  auVar172._8_4_ = auVar291._8_4_ * fVar163 + fVar167 * auVar227._8_4_;
  auVar172._12_4_ = auVar291._12_4_ * fVar164 + fVar195 * auVar227._12_4_;
  auVar137._0_4_ = auVar263._0_4_ * fVar134 + fVar165 * auVar248._0_4_;
  auVar137._4_4_ = auVar263._4_4_ * fVar162 + fVar166 * auVar248._4_4_;
  auVar137._8_4_ = auVar263._8_4_ * fVar163 + fVar167 * auVar248._8_4_;
  auVar137._12_4_ = auVar263._12_4_ * fVar164 + fVar195 * auVar248._12_4_;
  auVar239._0_4_ = auVar300._0_4_ * fVar134 + auVar330._0_4_ * fVar165;
  auVar239._4_4_ = auVar300._4_4_ * fVar162 + auVar330._4_4_ * fVar166;
  auVar239._8_4_ = auVar300._8_4_ * fVar163 + auVar330._8_4_ * fVar167;
  auVar239._12_4_ = auVar300._12_4_ * fVar164 + auVar330._12_4_ * fVar195;
  auVar182._0_4_ = auVar304._0_4_ * fVar134 + auVar276._0_4_ * fVar165;
  auVar182._4_4_ = auVar304._4_4_ * fVar162 + auVar276._4_4_ * fVar166;
  auVar182._8_4_ = auVar304._8_4_ * fVar163 + auVar276._8_4_ * fVar167;
  auVar182._12_4_ = auVar304._12_4_ * fVar164 + auVar276._12_4_ * fVar195;
  auVar82 = vmovshdup_avx(_local_4f8);
  auVar253 = vshufps_avx(_local_4f8,_local_4f8,0);
  auVar274._16_16_ = auVar253;
  auVar274._0_16_ = auVar253;
  auVar154 = vshufps_avx(_local_4f8,_local_4f8,0x55);
  auVar98._16_16_ = auVar154;
  auVar98._0_16_ = auVar154;
  auVar93 = vsubps_avx(auVar98,auVar274);
  auVar154 = vshufps_avx(auVar172,auVar172,0);
  auVar121 = vshufps_avx(auVar172,auVar172,0x55);
  auVar109 = vshufps_avx(auVar137,auVar137,0);
  auVar140 = vshufps_avx(auVar137,auVar137,0x55);
  auVar110 = vshufps_avx(auVar239,auVar239,0);
  auVar232 = vshufps_avx(auVar239,auVar239,0x55);
  auVar5 = vshufps_avx(auVar182,auVar182,0);
  auVar254 = vshufps_avx(auVar182,auVar182,0x55);
  auVar82 = ZEXT416((uint)((auVar82._0_4_ - local_4f8._0_4_) * 0.04761905));
  auVar82 = vshufps_avx(auVar82,auVar82,0);
  auVar290._0_4_ = auVar253._0_4_ + auVar93._0_4_ * 0.0;
  auVar290._4_4_ = auVar253._4_4_ + auVar93._4_4_ * 0.14285715;
  auVar290._8_4_ = auVar253._8_4_ + auVar93._8_4_ * 0.2857143;
  auVar290._12_4_ = auVar253._12_4_ + auVar93._12_4_ * 0.42857146;
  auVar290._16_4_ = auVar253._0_4_ + auVar93._16_4_ * 0.5714286;
  auVar290._20_4_ = auVar253._4_4_ + auVar93._20_4_ * 0.71428573;
  auVar290._24_4_ = auVar253._8_4_ + auVar93._24_4_ * 0.8571429;
  auVar290._28_4_ = auVar253._12_4_ + auVar93._28_4_;
  auVar14 = vsubps_avx(auVar324,auVar290);
  fVar134 = auVar109._0_4_;
  fVar163 = auVar109._4_4_;
  fVar165 = auVar109._8_4_;
  fVar167 = auVar109._12_4_;
  fVar267 = auVar14._0_4_;
  fVar277 = auVar14._4_4_;
  fVar278 = auVar14._8_4_;
  fVar279 = auVar14._12_4_;
  fVar280 = auVar14._16_4_;
  fVar281 = auVar14._20_4_;
  fVar282 = auVar14._24_4_;
  fVar234 = auVar140._0_4_;
  fVar264 = auVar140._4_4_;
  fVar265 = auVar140._8_4_;
  fVar266 = auVar140._12_4_;
  fVar318 = auVar121._12_4_ + 1.0;
  fVar229 = auVar110._0_4_;
  fVar230 = auVar110._4_4_;
  fVar231 = auVar110._8_4_;
  fVar233 = auVar110._12_4_;
  fVar212 = fVar229 * auVar290._0_4_ + fVar267 * fVar134;
  fVar213 = fVar230 * auVar290._4_4_ + fVar277 * fVar163;
  fVar214 = fVar231 * auVar290._8_4_ + fVar278 * fVar165;
  fVar215 = fVar233 * auVar290._12_4_ + fVar279 * fVar167;
  fVar216 = fVar229 * auVar290._16_4_ + fVar280 * fVar134;
  fVar217 = fVar230 * auVar290._20_4_ + fVar281 * fVar163;
  fVar218 = fVar231 * auVar290._24_4_ + fVar282 * fVar165;
  fVar162 = auVar232._0_4_;
  fVar164 = auVar232._4_4_;
  fVar166 = auVar232._8_4_;
  fVar195 = auVar232._12_4_;
  fVar301 = fVar234 * fVar267 + auVar290._0_4_ * fVar162;
  fVar305 = fVar264 * fVar277 + auVar290._4_4_ * fVar164;
  fVar306 = fVar265 * fVar278 + auVar290._8_4_ * fVar166;
  fVar307 = fVar266 * fVar279 + auVar290._12_4_ * fVar195;
  fVar308 = fVar234 * fVar280 + auVar290._16_4_ * fVar162;
  fVar309 = fVar264 * fVar281 + auVar290._20_4_ * fVar164;
  fVar310 = fVar265 * fVar282 + auVar290._24_4_ * fVar166;
  fVar311 = fVar266 + fVar167;
  auVar253 = vshufps_avx(auVar172,auVar172,0xaa);
  auVar109 = vshufps_avx(auVar172,auVar172,0xff);
  fVar228 = fVar233 + 0.0;
  auVar140 = vshufps_avx(auVar137,auVar137,0xaa);
  auVar110 = vshufps_avx(auVar137,auVar137,0xff);
  auVar193._0_4_ =
       fVar267 * (auVar290._0_4_ * fVar134 + fVar267 * auVar154._0_4_) + auVar290._0_4_ * fVar212;
  auVar193._4_4_ =
       fVar277 * (auVar290._4_4_ * fVar163 + fVar277 * auVar154._4_4_) + auVar290._4_4_ * fVar213;
  auVar193._8_4_ =
       fVar278 * (auVar290._8_4_ * fVar165 + fVar278 * auVar154._8_4_) + auVar290._8_4_ * fVar214;
  auVar193._12_4_ =
       fVar279 * (auVar290._12_4_ * fVar167 + fVar279 * auVar154._12_4_) + auVar290._12_4_ * fVar215
  ;
  auVar193._16_4_ =
       fVar280 * (auVar290._16_4_ * fVar134 + fVar280 * auVar154._0_4_) + auVar290._16_4_ * fVar216;
  auVar193._20_4_ =
       fVar281 * (auVar290._20_4_ * fVar163 + fVar281 * auVar154._4_4_) + auVar290._20_4_ * fVar217;
  auVar193._24_4_ =
       fVar282 * (auVar290._24_4_ * fVar165 + fVar282 * auVar154._8_4_) + auVar290._24_4_ * fVar218;
  auVar193._28_4_ = auVar154._12_4_ + 1.0 + fVar195;
  auVar210._0_4_ =
       fVar267 * (fVar234 * auVar290._0_4_ + auVar121._0_4_ * fVar267) + auVar290._0_4_ * fVar301;
  auVar210._4_4_ =
       fVar277 * (fVar264 * auVar290._4_4_ + auVar121._4_4_ * fVar277) + auVar290._4_4_ * fVar305;
  auVar210._8_4_ =
       fVar278 * (fVar265 * auVar290._8_4_ + auVar121._8_4_ * fVar278) + auVar290._8_4_ * fVar306;
  auVar210._12_4_ =
       fVar279 * (fVar266 * auVar290._12_4_ + auVar121._12_4_ * fVar279) + auVar290._12_4_ * fVar307
  ;
  auVar210._16_4_ =
       fVar280 * (fVar234 * auVar290._16_4_ + auVar121._0_4_ * fVar280) + auVar290._16_4_ * fVar308;
  auVar210._20_4_ =
       fVar281 * (fVar264 * auVar290._20_4_ + auVar121._4_4_ * fVar281) + auVar290._20_4_ * fVar309;
  auVar210._24_4_ =
       fVar282 * (fVar265 * auVar290._24_4_ + auVar121._8_4_ * fVar282) + auVar290._24_4_ * fVar310;
  auVar210._28_4_ = auVar254._12_4_ + fVar195;
  auVar99._0_4_ =
       fVar267 * fVar212 + auVar290._0_4_ * (fVar229 * fVar267 + auVar5._0_4_ * auVar290._0_4_);
  auVar99._4_4_ =
       fVar277 * fVar213 + auVar290._4_4_ * (fVar230 * fVar277 + auVar5._4_4_ * auVar290._4_4_);
  auVar99._8_4_ =
       fVar278 * fVar214 + auVar290._8_4_ * (fVar231 * fVar278 + auVar5._8_4_ * auVar290._8_4_);
  auVar99._12_4_ =
       fVar279 * fVar215 + auVar290._12_4_ * (fVar233 * fVar279 + auVar5._12_4_ * auVar290._12_4_);
  auVar99._16_4_ =
       fVar280 * fVar216 + auVar290._16_4_ * (fVar229 * fVar280 + auVar5._0_4_ * auVar290._16_4_);
  auVar99._20_4_ =
       fVar281 * fVar217 + auVar290._20_4_ * (fVar230 * fVar281 + auVar5._4_4_ * auVar290._20_4_);
  auVar99._24_4_ =
       fVar282 * fVar218 + auVar290._24_4_ * (fVar231 * fVar282 + auVar5._8_4_ * auVar290._24_4_);
  auVar99._28_4_ = fVar167 + 1.0 + fVar228;
  auVar299._0_4_ =
       fVar267 * fVar301 + auVar290._0_4_ * (auVar254._0_4_ * auVar290._0_4_ + fVar267 * fVar162);
  auVar299._4_4_ =
       fVar277 * fVar305 + auVar290._4_4_ * (auVar254._4_4_ * auVar290._4_4_ + fVar277 * fVar164);
  auVar299._8_4_ =
       fVar278 * fVar306 + auVar290._8_4_ * (auVar254._8_4_ * auVar290._8_4_ + fVar278 * fVar166);
  auVar299._12_4_ =
       fVar279 * fVar307 + auVar290._12_4_ * (auVar254._12_4_ * auVar290._12_4_ + fVar279 * fVar195)
  ;
  auVar299._16_4_ =
       fVar280 * fVar308 + auVar290._16_4_ * (auVar254._0_4_ * auVar290._16_4_ + fVar280 * fVar162);
  auVar299._20_4_ =
       fVar281 * fVar309 + auVar290._20_4_ * (auVar254._4_4_ * auVar290._20_4_ + fVar281 * fVar164);
  auVar299._24_4_ =
       fVar282 * fVar310 + auVar290._24_4_ * (auVar254._8_4_ * auVar290._24_4_ + fVar282 * fVar166);
  auVar299._28_4_ = fVar228 + fVar195 + 0.0;
  local_d8._0_4_ = fVar267 * auVar193._0_4_ + auVar290._0_4_ * auVar99._0_4_;
  local_d8._4_4_ = fVar277 * auVar193._4_4_ + auVar290._4_4_ * auVar99._4_4_;
  local_d8._8_4_ = fVar278 * auVar193._8_4_ + auVar290._8_4_ * auVar99._8_4_;
  local_d8._12_4_ = fVar279 * auVar193._12_4_ + auVar290._12_4_ * auVar99._12_4_;
  local_d8._16_4_ = fVar280 * auVar193._16_4_ + auVar290._16_4_ * auVar99._16_4_;
  local_d8._20_4_ = fVar281 * auVar193._20_4_ + auVar290._20_4_ * auVar99._20_4_;
  local_d8._24_4_ = fVar282 * auVar193._24_4_ + auVar290._24_4_ * auVar99._24_4_;
  local_d8._28_4_ = fVar311 + fVar195 + 0.0;
  auVar179._0_4_ = fVar267 * auVar210._0_4_ + auVar290._0_4_ * auVar299._0_4_;
  auVar179._4_4_ = fVar277 * auVar210._4_4_ + auVar290._4_4_ * auVar299._4_4_;
  auVar179._8_4_ = fVar278 * auVar210._8_4_ + auVar290._8_4_ * auVar299._8_4_;
  auVar179._12_4_ = fVar279 * auVar210._12_4_ + auVar290._12_4_ * auVar299._12_4_;
  auVar179._16_4_ = fVar280 * auVar210._16_4_ + auVar290._16_4_ * auVar299._16_4_;
  auVar179._20_4_ = fVar281 * auVar210._20_4_ + auVar290._20_4_ * auVar299._20_4_;
  auVar179._24_4_ = fVar282 * auVar210._24_4_ + auVar290._24_4_ * auVar299._24_4_;
  auVar179._28_4_ = fVar311 + fVar228;
  auVar15 = vsubps_avx(auVar99,auVar193);
  auVar93 = vsubps_avx(auVar299,auVar210);
  local_248._0_4_ = auVar82._0_4_;
  local_248._4_4_ = auVar82._4_4_;
  fStack_240 = auVar82._8_4_;
  fStack_23c = auVar82._12_4_;
  local_118 = (float)local_248._0_4_ * auVar15._0_4_ * 3.0;
  fStack_114 = (float)local_248._4_4_ * auVar15._4_4_ * 3.0;
  auVar23._4_4_ = fStack_114;
  auVar23._0_4_ = local_118;
  fStack_110 = fStack_240 * auVar15._8_4_ * 3.0;
  auVar23._8_4_ = fStack_110;
  fStack_10c = fStack_23c * auVar15._12_4_ * 3.0;
  auVar23._12_4_ = fStack_10c;
  fStack_108 = (float)local_248._0_4_ * auVar15._16_4_ * 3.0;
  auVar23._16_4_ = fStack_108;
  fStack_104 = (float)local_248._4_4_ * auVar15._20_4_ * 3.0;
  auVar23._20_4_ = fStack_104;
  fStack_100 = fStack_240 * auVar15._24_4_ * 3.0;
  auVar23._24_4_ = fStack_100;
  auVar23._28_4_ = auVar15._28_4_;
  local_138 = (float)local_248._0_4_ * auVar93._0_4_ * 3.0;
  fStack_134 = (float)local_248._4_4_ * auVar93._4_4_ * 3.0;
  auVar24._4_4_ = fStack_134;
  auVar24._0_4_ = local_138;
  fStack_130 = fStack_240 * auVar93._8_4_ * 3.0;
  auVar24._8_4_ = fStack_130;
  fStack_12c = fStack_23c * auVar93._12_4_ * 3.0;
  auVar24._12_4_ = fStack_12c;
  fStack_128 = (float)local_248._0_4_ * auVar93._16_4_ * 3.0;
  auVar24._16_4_ = fStack_128;
  fStack_124 = (float)local_248._4_4_ * auVar93._20_4_ * 3.0;
  auVar24._20_4_ = fStack_124;
  fStack_120 = fStack_240 * auVar93._24_4_ * 3.0;
  auVar24._24_4_ = fStack_120;
  auVar24._28_4_ = fVar311;
  auVar13 = vsubps_avx(local_d8,auVar23);
  auVar93 = vperm2f128_avx(auVar13,auVar13,1);
  auVar93 = vshufps_avx(auVar93,auVar13,0x30);
  auVar93 = vshufps_avx(auVar13,auVar93,0x29);
  auVar16 = vsubps_avx(auVar179,auVar24);
  auVar13 = vperm2f128_avx(auVar16,auVar16,1);
  auVar13 = vshufps_avx(auVar13,auVar16,0x30);
  _local_468 = vshufps_avx(auVar16,auVar13,0x29);
  fVar309 = auVar140._0_4_;
  fVar310 = auVar140._4_4_;
  fVar331 = auVar140._8_4_;
  fVar167 = auVar253._12_4_;
  fVar230 = auVar110._0_4_;
  fVar233 = auVar110._4_4_;
  fVar301 = auVar110._8_4_;
  fVar305 = auVar110._12_4_;
  auVar82 = vshufps_avx(auVar239,auVar239,0xaa);
  fVar134 = auVar82._0_4_;
  fVar163 = auVar82._4_4_;
  fVar165 = auVar82._8_4_;
  fVar195 = auVar82._12_4_;
  fVar214 = auVar290._0_4_ * fVar134 + fVar309 * fVar267;
  fVar215 = auVar290._4_4_ * fVar163 + fVar310 * fVar277;
  fVar216 = auVar290._8_4_ * fVar165 + fVar331 * fVar278;
  fVar217 = auVar290._12_4_ * fVar195 + auVar140._12_4_ * fVar279;
  fVar218 = auVar290._16_4_ * fVar134 + fVar309 * fVar280;
  fVar228 = auVar290._20_4_ * fVar163 + fVar310 * fVar281;
  fVar229 = auVar290._24_4_ * fVar165 + fVar331 * fVar282;
  auVar82 = vshufps_avx(auVar239,auVar239,0xff);
  fVar162 = auVar82._0_4_;
  fVar164 = auVar82._4_4_;
  fVar166 = auVar82._8_4_;
  fVar212 = auVar82._12_4_;
  fVar231 = auVar290._0_4_ * fVar162 + fVar230 * fVar267;
  fVar234 = auVar290._4_4_ * fVar164 + fVar233 * fVar277;
  fVar264 = auVar290._8_4_ * fVar166 + fVar301 * fVar278;
  fVar265 = auVar290._12_4_ * fVar212 + fVar305 * fVar279;
  fVar306 = auVar290._16_4_ * fVar162 + fVar230 * fVar280;
  fVar266 = auVar290._20_4_ * fVar164 + fVar233 * fVar281;
  fVar307 = auVar290._24_4_ * fVar166 + fVar301 * fVar282;
  auVar82 = vshufps_avx(auVar182,auVar182,0xaa);
  fVar308 = auVar82._12_4_ + fVar195;
  auVar154 = vshufps_avx(auVar182,auVar182,0xff);
  fVar213 = auVar154._12_4_;
  auVar100._0_4_ =
       fVar267 * (fVar309 * auVar290._0_4_ + fVar267 * auVar253._0_4_) + auVar290._0_4_ * fVar214;
  auVar100._4_4_ =
       fVar277 * (fVar310 * auVar290._4_4_ + fVar277 * auVar253._4_4_) + auVar290._4_4_ * fVar215;
  auVar100._8_4_ =
       fVar278 * (fVar331 * auVar290._8_4_ + fVar278 * auVar253._8_4_) + auVar290._8_4_ * fVar216;
  auVar100._12_4_ =
       fVar279 * (auVar140._12_4_ * auVar290._12_4_ + fVar279 * fVar167) + auVar290._12_4_ * fVar217
  ;
  auVar100._16_4_ =
       fVar280 * (fVar309 * auVar290._16_4_ + fVar280 * auVar253._0_4_) + auVar290._16_4_ * fVar218;
  auVar100._20_4_ =
       fVar281 * (fVar310 * auVar290._20_4_ + fVar281 * auVar253._4_4_) + auVar290._20_4_ * fVar228;
  auVar100._24_4_ =
       fVar282 * (fVar331 * auVar290._24_4_ + fVar282 * auVar253._8_4_) + auVar290._24_4_ * fVar229;
  auVar100._28_4_ = local_468._28_4_ + fVar167 + fVar213;
  auVar130._0_4_ =
       fVar267 * (fVar230 * auVar290._0_4_ + auVar109._0_4_ * fVar267) + auVar290._0_4_ * fVar231;
  auVar130._4_4_ =
       fVar277 * (fVar233 * auVar290._4_4_ + auVar109._4_4_ * fVar277) + auVar290._4_4_ * fVar234;
  auVar130._8_4_ =
       fVar278 * (fVar301 * auVar290._8_4_ + auVar109._8_4_ * fVar278) + auVar290._8_4_ * fVar264;
  auVar130._12_4_ =
       fVar279 * (fVar305 * auVar290._12_4_ + auVar109._12_4_ * fVar279) + auVar290._12_4_ * fVar265
  ;
  auVar130._16_4_ =
       fVar280 * (fVar230 * auVar290._16_4_ + auVar109._0_4_ * fVar280) + auVar290._16_4_ * fVar306;
  auVar130._20_4_ =
       fVar281 * (fVar233 * auVar290._20_4_ + auVar109._4_4_ * fVar281) + auVar290._20_4_ * fVar266;
  auVar130._24_4_ =
       fVar282 * (fVar301 * auVar290._24_4_ + auVar109._8_4_ * fVar282) + auVar290._24_4_ * fVar307;
  auVar130._28_4_ = fVar167 + auVar13._28_4_ + fVar213;
  auVar13 = vperm2f128_avx(local_d8,local_d8,1);
  auVar13 = vshufps_avx(auVar13,local_d8,0x30);
  local_348 = vshufps_avx(local_d8,auVar13,0x29);
  auVar211._0_4_ =
       auVar290._0_4_ * (auVar82._0_4_ * auVar290._0_4_ + fVar267 * fVar134) + fVar267 * fVar214;
  auVar211._4_4_ =
       auVar290._4_4_ * (auVar82._4_4_ * auVar290._4_4_ + fVar277 * fVar163) + fVar277 * fVar215;
  auVar211._8_4_ =
       auVar290._8_4_ * (auVar82._8_4_ * auVar290._8_4_ + fVar278 * fVar165) + fVar278 * fVar216;
  auVar211._12_4_ =
       auVar290._12_4_ * (auVar82._12_4_ * auVar290._12_4_ + fVar279 * fVar195) + fVar279 * fVar217;
  auVar211._16_4_ =
       auVar290._16_4_ * (auVar82._0_4_ * auVar290._16_4_ + fVar280 * fVar134) + fVar280 * fVar218;
  auVar211._20_4_ =
       auVar290._20_4_ * (auVar82._4_4_ * auVar290._20_4_ + fVar281 * fVar163) + fVar281 * fVar228;
  auVar211._24_4_ =
       auVar290._24_4_ * (auVar82._8_4_ * auVar290._24_4_ + fVar282 * fVar165) + fVar282 * fVar229;
  auVar211._28_4_ = fVar308 + fVar318 + auVar210._28_4_;
  auVar262._0_4_ =
       fVar267 * fVar231 + auVar290._0_4_ * (auVar290._0_4_ * auVar154._0_4_ + fVar267 * fVar162);
  auVar262._4_4_ =
       fVar277 * fVar234 + auVar290._4_4_ * (auVar290._4_4_ * auVar154._4_4_ + fVar277 * fVar164);
  auVar262._8_4_ =
       fVar278 * fVar264 + auVar290._8_4_ * (auVar290._8_4_ * auVar154._8_4_ + fVar278 * fVar166);
  auVar262._12_4_ =
       fVar279 * fVar265 + auVar290._12_4_ * (auVar290._12_4_ * fVar213 + fVar279 * fVar212);
  auVar262._16_4_ =
       fVar280 * fVar306 + auVar290._16_4_ * (auVar290._16_4_ * auVar154._0_4_ + fVar280 * fVar162);
  auVar262._20_4_ =
       fVar281 * fVar266 + auVar290._20_4_ * (auVar290._20_4_ * auVar154._4_4_ + fVar281 * fVar164);
  auVar262._24_4_ =
       fVar282 * fVar307 + auVar290._24_4_ * (auVar290._24_4_ * auVar154._8_4_ + fVar282 * fVar166);
  auVar262._28_4_ = fVar318 + fVar305 + fVar213 + fVar212;
  auVar247._0_4_ = fVar267 * auVar100._0_4_ + auVar290._0_4_ * auVar211._0_4_;
  auVar247._4_4_ = fVar277 * auVar100._4_4_ + auVar290._4_4_ * auVar211._4_4_;
  auVar247._8_4_ = fVar278 * auVar100._8_4_ + auVar290._8_4_ * auVar211._8_4_;
  auVar247._12_4_ = fVar279 * auVar100._12_4_ + auVar290._12_4_ * auVar211._12_4_;
  auVar247._16_4_ = fVar280 * auVar100._16_4_ + auVar290._16_4_ * auVar211._16_4_;
  auVar247._20_4_ = fVar281 * auVar100._20_4_ + auVar290._20_4_ * auVar211._20_4_;
  auVar247._24_4_ = fVar282 * auVar100._24_4_ + auVar290._24_4_ * auVar211._24_4_;
  auVar247._28_4_ = fVar308 + fVar213 + fVar212;
  auVar275._0_4_ = fVar267 * auVar130._0_4_ + auVar290._0_4_ * auVar262._0_4_;
  auVar275._4_4_ = fVar277 * auVar130._4_4_ + auVar290._4_4_ * auVar262._4_4_;
  auVar275._8_4_ = fVar278 * auVar130._8_4_ + auVar290._8_4_ * auVar262._8_4_;
  auVar275._12_4_ = fVar279 * auVar130._12_4_ + auVar290._12_4_ * auVar262._12_4_;
  auVar275._16_4_ = fVar280 * auVar130._16_4_ + auVar290._16_4_ * auVar262._16_4_;
  auVar275._20_4_ = fVar281 * auVar130._20_4_ + auVar290._20_4_ * auVar262._20_4_;
  auVar275._24_4_ = fVar282 * auVar130._24_4_ + auVar290._24_4_ * auVar262._24_4_;
  auVar275._28_4_ = auVar14._28_4_ + auVar290._28_4_;
  auVar14 = vsubps_avx(auVar211,auVar100);
  auVar13 = vsubps_avx(auVar262,auVar130);
  local_158 = (float)local_248._0_4_ * auVar14._0_4_ * 3.0;
  fStack_154 = (float)local_248._4_4_ * auVar14._4_4_ * 3.0;
  auVar25._4_4_ = fStack_154;
  auVar25._0_4_ = local_158;
  fStack_150 = fStack_240 * auVar14._8_4_ * 3.0;
  auVar25._8_4_ = fStack_150;
  fStack_14c = fStack_23c * auVar14._12_4_ * 3.0;
  auVar25._12_4_ = fStack_14c;
  fStack_148 = (float)local_248._0_4_ * auVar14._16_4_ * 3.0;
  auVar25._16_4_ = fStack_148;
  fStack_144 = (float)local_248._4_4_ * auVar14._20_4_ * 3.0;
  auVar25._20_4_ = fStack_144;
  fStack_140 = fStack_240 * auVar14._24_4_ * 3.0;
  auVar25._24_4_ = fStack_140;
  auVar25._28_4_ = auVar14._28_4_;
  local_178 = (float)local_248._0_4_ * auVar13._0_4_ * 3.0;
  fStack_174 = (float)local_248._4_4_ * auVar13._4_4_ * 3.0;
  auVar26._4_4_ = fStack_174;
  auVar26._0_4_ = local_178;
  fStack_170 = fStack_240 * auVar13._8_4_ * 3.0;
  auVar26._8_4_ = fStack_170;
  fStack_16c = fStack_23c * auVar13._12_4_ * 3.0;
  auVar26._12_4_ = fStack_16c;
  fStack_168 = (float)local_248._0_4_ * auVar13._16_4_ * 3.0;
  auVar26._16_4_ = fStack_168;
  fStack_164 = (float)local_248._4_4_ * auVar13._20_4_ * 3.0;
  auVar26._20_4_ = fStack_164;
  fStack_160 = fStack_240 * auVar13._24_4_ * 3.0;
  auVar26._24_4_ = fStack_160;
  auVar26._28_4_ = auVar211._28_4_;
  auVar13 = vperm2f128_avx(auVar247,auVar247,1);
  auVar13 = vshufps_avx(auVar13,auVar247,0x30);
  auVar17 = vshufps_avx(auVar247,auVar13,0x29);
  auVar16 = vsubps_avx(auVar247,auVar25);
  auVar13 = vperm2f128_avx(auVar16,auVar16,1);
  auVar13 = vshufps_avx(auVar13,auVar16,0x30);
  _local_248 = vshufps_avx(auVar16,auVar13,0x29);
  auVar97 = _local_248;
  auVar16 = vsubps_avx(auVar275,auVar26);
  auVar13 = vperm2f128_avx(auVar16,auVar16,1);
  auVar13 = vshufps_avx(auVar13,auVar16,0x30);
  local_b8 = vshufps_avx(auVar16,auVar13,0x29);
  auVar16 = vsubps_avx(auVar247,local_d8);
  auVar18 = vsubps_avx(auVar17,local_348);
  fVar134 = auVar18._0_4_ + auVar16._0_4_;
  fVar162 = auVar18._4_4_ + auVar16._4_4_;
  fVar163 = auVar18._8_4_ + auVar16._8_4_;
  fVar164 = auVar18._12_4_ + auVar16._12_4_;
  fVar165 = auVar18._16_4_ + auVar16._16_4_;
  fVar166 = auVar18._20_4_ + auVar16._20_4_;
  fVar167 = auVar18._24_4_ + auVar16._24_4_;
  auVar13 = vperm2f128_avx(auVar179,auVar179,1);
  auVar13 = vshufps_avx(auVar13,auVar179,0x30);
  local_f8 = vshufps_avx(auVar179,auVar13,0x29);
  auVar13 = vperm2f128_avx(auVar275,auVar275,1);
  auVar13 = vshufps_avx(auVar13,auVar275,0x30);
  _local_448 = vshufps_avx(auVar275,auVar13,0x29);
  auVar13 = vsubps_avx(auVar275,auVar179);
  auVar19 = vsubps_avx(_local_448,local_f8);
  fVar195 = auVar19._0_4_ + auVar13._0_4_;
  fVar212 = auVar19._4_4_ + auVar13._4_4_;
  fVar213 = auVar19._8_4_ + auVar13._8_4_;
  fVar214 = auVar19._12_4_ + auVar13._12_4_;
  fVar215 = auVar19._16_4_ + auVar13._16_4_;
  fVar216 = auVar19._20_4_ + auVar13._20_4_;
  fVar217 = auVar19._24_4_ + auVar13._24_4_;
  auVar27._4_4_ = fVar162 * auVar179._4_4_;
  auVar27._0_4_ = fVar134 * auVar179._0_4_;
  auVar27._8_4_ = fVar163 * auVar179._8_4_;
  auVar27._12_4_ = fVar164 * auVar179._12_4_;
  auVar27._16_4_ = fVar165 * auVar179._16_4_;
  auVar27._20_4_ = fVar166 * auVar179._20_4_;
  auVar27._24_4_ = fVar167 * auVar179._24_4_;
  auVar27._28_4_ = auVar13._28_4_;
  auVar28._4_4_ = fVar212 * local_d8._4_4_;
  auVar28._0_4_ = fVar195 * local_d8._0_4_;
  auVar28._8_4_ = fVar213 * local_d8._8_4_;
  auVar28._12_4_ = fVar214 * local_d8._12_4_;
  auVar28._16_4_ = fVar215 * local_d8._16_4_;
  auVar28._20_4_ = fVar216 * local_d8._20_4_;
  auVar28._24_4_ = fVar217 * local_d8._24_4_;
  auVar28._28_4_ = fVar308;
  auVar20 = vsubps_avx(auVar27,auVar28);
  local_118 = local_d8._0_4_ + local_118;
  fStack_114 = local_d8._4_4_ + fStack_114;
  fStack_110 = local_d8._8_4_ + fStack_110;
  fStack_10c = local_d8._12_4_ + fStack_10c;
  fStack_108 = local_d8._16_4_ + fStack_108;
  fStack_104 = local_d8._20_4_ + fStack_104;
  fStack_100 = local_d8._24_4_ + fStack_100;
  fStack_fc = local_d8._28_4_ + auVar15._28_4_;
  local_138 = local_138 + auVar179._0_4_;
  fStack_134 = fStack_134 + auVar179._4_4_;
  fStack_130 = fStack_130 + auVar179._8_4_;
  fStack_12c = fStack_12c + auVar179._12_4_;
  fStack_128 = fStack_128 + auVar179._16_4_;
  fStack_124 = fStack_124 + auVar179._20_4_;
  fStack_120 = fStack_120 + auVar179._24_4_;
  fStack_11c = fVar311 + auVar179._28_4_;
  auVar29._4_4_ = fVar162 * fStack_134;
  auVar29._0_4_ = fVar134 * local_138;
  auVar29._8_4_ = fVar163 * fStack_130;
  auVar29._12_4_ = fVar164 * fStack_12c;
  auVar29._16_4_ = fVar165 * fStack_128;
  auVar29._20_4_ = fVar166 * fStack_124;
  auVar29._24_4_ = fVar167 * fStack_120;
  auVar29._28_4_ = fVar311;
  auVar30._4_4_ = fVar212 * fStack_114;
  auVar30._0_4_ = fVar195 * local_118;
  auVar30._8_4_ = fVar213 * fStack_110;
  auVar30._12_4_ = fVar214 * fStack_10c;
  auVar30._16_4_ = fVar215 * fStack_108;
  auVar30._20_4_ = fVar216 * fStack_104;
  auVar30._24_4_ = fVar217 * fStack_100;
  auVar30._28_4_ = fVar311 + auVar179._28_4_;
  auVar15 = vsubps_avx(auVar29,auVar30);
  auVar31._4_4_ = fVar162 * (float)local_468._4_4_;
  auVar31._0_4_ = fVar134 * (float)local_468._0_4_;
  auVar31._8_4_ = fVar163 * fStack_460;
  auVar31._12_4_ = fVar164 * fStack_45c;
  auVar31._16_4_ = fVar165 * fStack_458;
  auVar31._20_4_ = fVar166 * fStack_454;
  auVar31._24_4_ = fVar167 * fStack_450;
  auVar31._28_4_ = fVar311;
  local_4a8._0_4_ = auVar93._0_4_;
  local_4a8._4_4_ = auVar93._4_4_;
  fStack_4a0 = auVar93._8_4_;
  fStack_49c = auVar93._12_4_;
  fStack_498 = auVar93._16_4_;
  fStack_494 = auVar93._20_4_;
  fStack_490 = auVar93._24_4_;
  auVar32._4_4_ = fVar212 * (float)local_4a8._4_4_;
  auVar32._0_4_ = fVar195 * (float)local_4a8._0_4_;
  auVar32._8_4_ = fVar213 * fStack_4a0;
  auVar32._12_4_ = fVar214 * fStack_49c;
  auVar32._16_4_ = fVar215 * fStack_498;
  auVar32._20_4_ = fVar216 * fStack_494;
  auVar32._24_4_ = fVar217 * fStack_490;
  auVar32._28_4_ = local_d8._28_4_;
  auVar21 = vsubps_avx(auVar31,auVar32);
  auVar33._4_4_ = local_f8._4_4_ * fVar162;
  auVar33._0_4_ = local_f8._0_4_ * fVar134;
  auVar33._8_4_ = local_f8._8_4_ * fVar163;
  auVar33._12_4_ = local_f8._12_4_ * fVar164;
  auVar33._16_4_ = local_f8._16_4_ * fVar165;
  auVar33._20_4_ = local_f8._20_4_ * fVar166;
  auVar33._24_4_ = local_f8._24_4_ * fVar167;
  auVar33._28_4_ = fVar311;
  auVar34._4_4_ = local_348._4_4_ * fVar212;
  auVar34._0_4_ = local_348._0_4_ * fVar195;
  auVar34._8_4_ = local_348._8_4_ * fVar213;
  auVar34._12_4_ = local_348._12_4_ * fVar214;
  auVar34._16_4_ = local_348._16_4_ * fVar215;
  auVar34._20_4_ = local_348._20_4_ * fVar216;
  auVar34._24_4_ = local_348._24_4_ * fVar217;
  auVar34._28_4_ = local_f8._28_4_;
  auVar22 = vsubps_avx(auVar33,auVar34);
  auVar35._4_4_ = auVar275._4_4_ * fVar162;
  auVar35._0_4_ = auVar275._0_4_ * fVar134;
  auVar35._8_4_ = auVar275._8_4_ * fVar163;
  auVar35._12_4_ = auVar275._12_4_ * fVar164;
  auVar35._16_4_ = auVar275._16_4_ * fVar165;
  auVar35._20_4_ = auVar275._20_4_ * fVar166;
  auVar35._24_4_ = auVar275._24_4_ * fVar167;
  auVar35._28_4_ = fVar311;
  auVar36._4_4_ = fVar212 * auVar247._4_4_;
  auVar36._0_4_ = fVar195 * auVar247._0_4_;
  auVar36._8_4_ = fVar213 * auVar247._8_4_;
  auVar36._12_4_ = fVar214 * auVar247._12_4_;
  auVar36._16_4_ = fVar215 * auVar247._16_4_;
  auVar36._20_4_ = fVar216 * auVar247._20_4_;
  auVar36._24_4_ = fVar217 * auVar247._24_4_;
  auVar36._28_4_ = fStack_fc;
  auVar94 = vsubps_avx(auVar35,auVar36);
  local_158 = auVar247._0_4_ + local_158;
  fStack_154 = auVar247._4_4_ + fStack_154;
  fStack_150 = auVar247._8_4_ + fStack_150;
  fStack_14c = auVar247._12_4_ + fStack_14c;
  fStack_148 = auVar247._16_4_ + fStack_148;
  fStack_144 = auVar247._20_4_ + fStack_144;
  fStack_140 = auVar247._24_4_ + fStack_140;
  fStack_13c = auVar247._28_4_ + auVar14._28_4_;
  local_178 = auVar275._0_4_ + local_178;
  fStack_174 = auVar275._4_4_ + fStack_174;
  fStack_170 = auVar275._8_4_ + fStack_170;
  fStack_16c = auVar275._12_4_ + fStack_16c;
  fStack_168 = auVar275._16_4_ + fStack_168;
  fStack_164 = auVar275._20_4_ + fStack_164;
  fStack_160 = auVar275._24_4_ + fStack_160;
  fStack_15c = auVar275._28_4_ + auVar211._28_4_;
  auVar37._4_4_ = fVar162 * fStack_174;
  auVar37._0_4_ = fVar134 * local_178;
  auVar37._8_4_ = fVar163 * fStack_170;
  auVar37._12_4_ = fVar164 * fStack_16c;
  auVar37._16_4_ = fVar165 * fStack_168;
  auVar37._20_4_ = fVar166 * fStack_164;
  auVar37._24_4_ = fVar167 * fStack_160;
  auVar37._28_4_ = auVar275._28_4_ + auVar211._28_4_;
  auVar38._4_4_ = fStack_154 * fVar212;
  auVar38._0_4_ = local_158 * fVar195;
  auVar38._8_4_ = fStack_150 * fVar213;
  auVar38._12_4_ = fStack_14c * fVar214;
  auVar38._16_4_ = fStack_148 * fVar215;
  auVar38._20_4_ = fStack_144 * fVar216;
  auVar38._24_4_ = fStack_140 * fVar217;
  auVar38._28_4_ = fStack_13c;
  auVar95 = vsubps_avx(auVar37,auVar38);
  auVar39._4_4_ = fVar162 * local_b8._4_4_;
  auVar39._0_4_ = fVar134 * local_b8._0_4_;
  auVar39._8_4_ = fVar163 * local_b8._8_4_;
  auVar39._12_4_ = fVar164 * local_b8._12_4_;
  auVar39._16_4_ = fVar165 * local_b8._16_4_;
  auVar39._20_4_ = fVar166 * local_b8._20_4_;
  auVar39._24_4_ = fVar167 * local_b8._24_4_;
  auVar39._28_4_ = fStack_13c;
  auVar40._4_4_ = fVar212 * (float)local_248._4_4_;
  auVar40._0_4_ = fVar195 * (float)local_248._0_4_;
  auVar40._8_4_ = fVar213 * fStack_240;
  auVar40._12_4_ = fVar214 * fStack_23c;
  auVar40._16_4_ = fVar215 * fStack_238;
  auVar40._20_4_ = fVar216 * fStack_234;
  auVar40._24_4_ = fVar217 * fStack_230;
  auVar40._28_4_ = local_b8._28_4_;
  auVar96 = vsubps_avx(auVar39,auVar40);
  auVar41._4_4_ = fVar162 * local_448._4_4_;
  auVar41._0_4_ = fVar134 * local_448._0_4_;
  auVar41._8_4_ = fVar163 * local_448._8_4_;
  auVar41._12_4_ = fVar164 * local_448._12_4_;
  auVar41._16_4_ = fVar165 * local_448._16_4_;
  auVar41._20_4_ = fVar166 * local_448._20_4_;
  auVar41._24_4_ = fVar167 * local_448._24_4_;
  auVar41._28_4_ = auVar18._28_4_ + auVar16._28_4_;
  auVar42._4_4_ = auVar17._4_4_ * fVar212;
  auVar42._0_4_ = auVar17._0_4_ * fVar195;
  auVar42._8_4_ = auVar17._8_4_ * fVar213;
  auVar42._12_4_ = auVar17._12_4_ * fVar214;
  auVar42._16_4_ = auVar17._16_4_ * fVar215;
  auVar42._20_4_ = auVar17._20_4_ * fVar216;
  auVar42._24_4_ = auVar17._24_4_ * fVar217;
  auVar42._28_4_ = auVar19._28_4_ + auVar13._28_4_;
  auVar18 = vsubps_avx(auVar41,auVar42);
  auVar13 = vminps_avx(auVar20,auVar15);
  auVar93 = vmaxps_avx(auVar20,auVar15);
  auVar14 = vminps_avx(auVar21,auVar22);
  auVar14 = vminps_avx(auVar13,auVar14);
  auVar13 = vmaxps_avx(auVar21,auVar22);
  auVar93 = vmaxps_avx(auVar93,auVar13);
  auVar15 = vminps_avx(auVar94,auVar95);
  auVar13 = vmaxps_avx(auVar94,auVar95);
  auVar16 = vminps_avx(auVar96,auVar18);
  auVar16 = vminps_avx(auVar15,auVar16);
  auVar16 = vminps_avx(auVar14,auVar16);
  auVar14 = vmaxps_avx(auVar96,auVar18);
  auVar13 = vmaxps_avx(auVar13,auVar14);
  auVar13 = vmaxps_avx(auVar93,auVar13);
  auVar93 = vcmpps_avx(auVar16,local_78,2);
  auVar13 = vcmpps_avx(auVar13,local_98,5);
  auVar93 = vandps_avx(auVar13,auVar93);
  auVar13 = local_198 & auVar93;
  if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar13 >> 0x7f,0) != '\0') ||
        (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar13 >> 0xbf,0) != '\0') ||
      (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar13[0x1f] < '\0') {
    auVar13 = vsubps_avx(local_348,local_d8);
    auVar14 = vsubps_avx(auVar17,auVar247);
    fVar162 = auVar13._0_4_ + auVar14._0_4_;
    fVar163 = auVar13._4_4_ + auVar14._4_4_;
    fVar164 = auVar13._8_4_ + auVar14._8_4_;
    fVar165 = auVar13._12_4_ + auVar14._12_4_;
    fVar166 = auVar13._16_4_ + auVar14._16_4_;
    fVar167 = auVar13._20_4_ + auVar14._20_4_;
    fVar195 = auVar13._24_4_ + auVar14._24_4_;
    auVar16 = vsubps_avx(local_f8,auVar179);
    auVar18 = vsubps_avx(_local_448,auVar275);
    fVar212 = auVar16._0_4_ + auVar18._0_4_;
    fVar213 = auVar16._4_4_ + auVar18._4_4_;
    fVar214 = auVar16._8_4_ + auVar18._8_4_;
    fVar215 = auVar16._12_4_ + auVar18._12_4_;
    fVar216 = auVar16._16_4_ + auVar18._16_4_;
    fVar217 = auVar16._20_4_ + auVar18._20_4_;
    fVar218 = auVar16._24_4_ + auVar18._24_4_;
    fVar134 = auVar18._28_4_;
    auVar43._4_4_ = auVar179._4_4_ * fVar163;
    auVar43._0_4_ = auVar179._0_4_ * fVar162;
    auVar43._8_4_ = auVar179._8_4_ * fVar164;
    auVar43._12_4_ = auVar179._12_4_ * fVar165;
    auVar43._16_4_ = auVar179._16_4_ * fVar166;
    auVar43._20_4_ = auVar179._20_4_ * fVar167;
    auVar43._24_4_ = auVar179._24_4_ * fVar195;
    auVar43._28_4_ = auVar179._28_4_;
    auVar44._4_4_ = local_d8._4_4_ * fVar213;
    auVar44._0_4_ = local_d8._0_4_ * fVar212;
    auVar44._8_4_ = local_d8._8_4_ * fVar214;
    auVar44._12_4_ = local_d8._12_4_ * fVar215;
    auVar44._16_4_ = local_d8._16_4_ * fVar216;
    auVar44._20_4_ = local_d8._20_4_ * fVar217;
    auVar44._24_4_ = local_d8._24_4_ * fVar218;
    auVar44._28_4_ = local_d8._28_4_;
    auVar18 = vsubps_avx(auVar43,auVar44);
    auVar45._4_4_ = fVar163 * fStack_134;
    auVar45._0_4_ = fVar162 * local_138;
    auVar45._8_4_ = fVar164 * fStack_130;
    auVar45._12_4_ = fVar165 * fStack_12c;
    auVar45._16_4_ = fVar166 * fStack_128;
    auVar45._20_4_ = fVar167 * fStack_124;
    auVar45._24_4_ = fVar195 * fStack_120;
    auVar45._28_4_ = auVar179._28_4_;
    auVar46._4_4_ = fVar213 * fStack_114;
    auVar46._0_4_ = fVar212 * local_118;
    auVar46._8_4_ = fVar214 * fStack_110;
    auVar46._12_4_ = fVar215 * fStack_10c;
    auVar46._16_4_ = fVar216 * fStack_108;
    auVar46._20_4_ = fVar217 * fStack_104;
    auVar46._24_4_ = fVar218 * fStack_100;
    auVar46._28_4_ = fVar134;
    auVar19 = vsubps_avx(auVar45,auVar46);
    auVar47._4_4_ = fVar163 * (float)local_468._4_4_;
    auVar47._0_4_ = fVar162 * (float)local_468._0_4_;
    auVar47._8_4_ = fVar164 * fStack_460;
    auVar47._12_4_ = fVar165 * fStack_45c;
    auVar47._16_4_ = fVar166 * fStack_458;
    auVar47._20_4_ = fVar167 * fStack_454;
    auVar47._24_4_ = fVar195 * fStack_450;
    auVar47._28_4_ = fVar134;
    auVar48._4_4_ = fVar213 * (float)local_4a8._4_4_;
    auVar48._0_4_ = fVar212 * (float)local_4a8._0_4_;
    auVar48._8_4_ = fVar214 * fStack_4a0;
    auVar48._12_4_ = fVar215 * fStack_49c;
    auVar48._16_4_ = fVar216 * fStack_498;
    auVar48._20_4_ = fVar217 * fStack_494;
    auVar48._24_4_ = fVar218 * fStack_490;
    auVar48._28_4_ = auVar15._28_4_;
    auVar20 = vsubps_avx(auVar47,auVar48);
    auVar49._4_4_ = local_f8._4_4_ * fVar163;
    auVar49._0_4_ = local_f8._0_4_ * fVar162;
    auVar49._8_4_ = local_f8._8_4_ * fVar164;
    auVar49._12_4_ = local_f8._12_4_ * fVar165;
    auVar49._16_4_ = local_f8._16_4_ * fVar166;
    auVar49._20_4_ = local_f8._20_4_ * fVar167;
    auVar49._24_4_ = local_f8._24_4_ * fVar195;
    auVar49._28_4_ = auVar15._28_4_;
    auVar50._4_4_ = local_348._4_4_ * fVar213;
    auVar50._0_4_ = local_348._0_4_ * fVar212;
    auVar50._8_4_ = local_348._8_4_ * fVar214;
    auVar50._12_4_ = local_348._12_4_ * fVar215;
    auVar50._16_4_ = local_348._16_4_ * fVar216;
    auVar50._20_4_ = local_348._20_4_ * fVar217;
    uVar73 = local_348._28_4_;
    auVar50._24_4_ = local_348._24_4_ * fVar218;
    auVar50._28_4_ = uVar73;
    auVar21 = vsubps_avx(auVar49,auVar50);
    auVar51._4_4_ = auVar275._4_4_ * fVar163;
    auVar51._0_4_ = auVar275._0_4_ * fVar162;
    auVar51._8_4_ = auVar275._8_4_ * fVar164;
    auVar51._12_4_ = auVar275._12_4_ * fVar165;
    auVar51._16_4_ = auVar275._16_4_ * fVar166;
    auVar51._20_4_ = auVar275._20_4_ * fVar167;
    auVar51._24_4_ = auVar275._24_4_ * fVar195;
    auVar51._28_4_ = uVar73;
    auVar52._4_4_ = auVar247._4_4_ * fVar213;
    auVar52._0_4_ = auVar247._0_4_ * fVar212;
    auVar52._8_4_ = auVar247._8_4_ * fVar214;
    auVar52._12_4_ = auVar247._12_4_ * fVar215;
    auVar52._16_4_ = auVar247._16_4_ * fVar216;
    auVar52._20_4_ = auVar247._20_4_ * fVar217;
    auVar52._24_4_ = auVar247._24_4_ * fVar218;
    auVar52._28_4_ = auVar247._28_4_;
    auVar22 = vsubps_avx(auVar51,auVar52);
    auVar53._4_4_ = fVar163 * fStack_174;
    auVar53._0_4_ = fVar162 * local_178;
    auVar53._8_4_ = fVar164 * fStack_170;
    auVar53._12_4_ = fVar165 * fStack_16c;
    auVar53._16_4_ = fVar166 * fStack_168;
    auVar53._20_4_ = fVar167 * fStack_164;
    auVar53._24_4_ = fVar195 * fStack_160;
    auVar53._28_4_ = uVar73;
    auVar54._4_4_ = fVar213 * fStack_154;
    auVar54._0_4_ = fVar212 * local_158;
    auVar54._8_4_ = fVar214 * fStack_150;
    auVar54._12_4_ = fVar215 * fStack_14c;
    auVar54._16_4_ = fVar216 * fStack_148;
    auVar54._20_4_ = fVar217 * fStack_144;
    auVar54._24_4_ = fVar218 * fStack_140;
    auVar54._28_4_ = auVar275._28_4_;
    auVar94 = vsubps_avx(auVar53,auVar54);
    auVar55._4_4_ = fVar163 * local_b8._4_4_;
    auVar55._0_4_ = fVar162 * local_b8._0_4_;
    auVar55._8_4_ = fVar164 * local_b8._8_4_;
    auVar55._12_4_ = fVar165 * local_b8._12_4_;
    auVar55._16_4_ = fVar166 * local_b8._16_4_;
    auVar55._20_4_ = fVar167 * local_b8._20_4_;
    auVar55._24_4_ = fVar195 * local_b8._24_4_;
    auVar55._28_4_ = auVar275._28_4_;
    auVar56._4_4_ = (float)local_248._4_4_ * fVar213;
    auVar56._0_4_ = (float)local_248._0_4_ * fVar212;
    auVar56._8_4_ = fStack_240 * fVar214;
    auVar56._12_4_ = fStack_23c * fVar215;
    auVar56._16_4_ = fStack_238 * fVar216;
    auVar56._20_4_ = fStack_234 * fVar217;
    auVar56._24_4_ = fStack_230 * fVar218;
    auVar56._28_4_ = local_f8._28_4_;
    auVar95 = vsubps_avx(auVar55,auVar56);
    auVar57._4_4_ = fVar163 * local_448._4_4_;
    auVar57._0_4_ = fVar162 * local_448._0_4_;
    auVar57._8_4_ = fVar164 * local_448._8_4_;
    auVar57._12_4_ = fVar165 * local_448._12_4_;
    auVar57._16_4_ = fVar166 * local_448._16_4_;
    auVar57._20_4_ = fVar167 * local_448._20_4_;
    auVar57._24_4_ = fVar195 * local_448._24_4_;
    auVar57._28_4_ = auVar13._28_4_ + auVar14._28_4_;
    auVar58._4_4_ = auVar17._4_4_ * fVar213;
    auVar58._0_4_ = auVar17._0_4_ * fVar212;
    auVar58._8_4_ = auVar17._8_4_ * fVar214;
    auVar58._12_4_ = auVar17._12_4_ * fVar215;
    auVar58._16_4_ = auVar17._16_4_ * fVar216;
    auVar58._20_4_ = auVar17._20_4_ * fVar217;
    auVar58._24_4_ = auVar17._24_4_ * fVar218;
    auVar58._28_4_ = auVar16._28_4_ + fVar134;
    auVar96 = vsubps_avx(auVar57,auVar58);
    auVar14 = vminps_avx(auVar18,auVar19);
    auVar13 = vmaxps_avx(auVar18,auVar19);
    auVar15 = vminps_avx(auVar20,auVar21);
    auVar15 = vminps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(auVar20,auVar21);
    auVar13 = vmaxps_avx(auVar13,auVar14);
    auVar16 = vminps_avx(auVar22,auVar94);
    auVar14 = vmaxps_avx(auVar22,auVar94);
    auVar17 = vminps_avx(auVar95,auVar96);
    auVar16 = vminps_avx(auVar16,auVar17);
    auVar16 = vminps_avx(auVar15,auVar16);
    auVar15 = vmaxps_avx(auVar95,auVar96);
    auVar14 = vmaxps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(auVar13,auVar14);
    auVar13 = vcmpps_avx(auVar16,local_78,2);
    auVar14 = vcmpps_avx(auVar14,local_98,5);
    auVar13 = vandps_avx(auVar14,auVar13);
    auVar93 = vandps_avx(local_198,auVar93);
    auVar14 = auVar93 & auVar13;
    if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0x7f,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar14 >> 0xbf,0) != '\0') ||
        (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar14[0x1f] < '\0')
    {
      auVar93 = vandps_avx(auVar13,auVar93);
      uVar65 = vmovmskps_avx(auVar93);
      if (uVar65 != 0) {
        _local_248 = auVar97;
        auStack_2c8[uVar71] = uVar65 & 0xff;
        uVar2 = vmovlps_avx(_local_4f8);
        *(undefined8 *)(afStack_1d8 + uVar71 * 2) = uVar2;
        uVar3 = vmovlps_avx(auVar313);
        auStack_58[uVar71] = uVar3;
        uVar71 = (ulong)((int)uVar71 + 1);
        auVar97 = _local_248;
      }
    }
  }
LAB_00a21eb4:
  do {
    do {
      do {
        do {
          _local_248 = auVar97;
          if ((int)uVar71 == 0) {
            if ((uVar72 & 1) != 0) goto LAB_00a22e31;
            fVar134 = ray->tfar;
            auVar103._4_4_ = fVar134;
            auVar103._0_4_ = fVar134;
            auVar103._8_4_ = fVar134;
            auVar103._12_4_ = fVar134;
            auVar103._16_4_ = fVar134;
            auVar103._20_4_ = fVar134;
            auVar103._24_4_ = fVar134;
            auVar103._28_4_ = fVar134;
            auVar93 = vcmpps_avx(local_1b8,auVar103,2);
            uVar65 = vmovmskps_avx(auVar93);
            uVar66 = (ulong)((uint)uVar70 & uVar65);
            goto LAB_00a21062;
          }
          uVar68 = (int)uVar71 - 1;
          uVar69 = (ulong)uVar68;
          uVar65 = auStack_2c8[uVar69];
          fVar134 = afStack_1d8[uVar69 * 2];
          fVar162 = afStack_1d8[uVar69 * 2 + 1];
          auVar314._8_8_ = 0;
          auVar314._0_8_ = auStack_58[uVar69];
          auVar317 = ZEXT1664(auVar314);
          uVar3 = 0;
          if (uVar65 != 0) {
            for (; (uVar65 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
            }
          }
          uVar65 = uVar65 - 1 & uVar65;
          auStack_2c8[uVar69] = uVar65;
          if (uVar65 == 0) {
            uVar71 = (ulong)uVar68;
          }
          auVar227 = ZEXT1664(local_358);
          auVar248 = ZEXT1664(local_368);
          auVar330 = ZEXT1664(local_378);
          auVar276 = ZEXT1664(local_388);
          auVar291 = ZEXT1664(local_398);
          auVar263 = ZEXT1664(local_3a8);
          auVar300 = ZEXT1664(local_3b8);
          auVar304 = ZEXT1664(local_3c8);
          fVar164 = (float)(uVar3 + 1) * 0.14285715;
          fVar163 = (1.0 - (float)uVar3 * 0.14285715) * fVar134 +
                    fVar162 * (float)uVar3 * 0.14285715;
          fVar134 = (1.0 - fVar164) * fVar134 + fVar162 * fVar164;
          fVar162 = fVar134 - fVar163;
          if (0.16666667 <= fVar162) {
            _local_4f8 = vinsertps_avx(ZEXT416((uint)fVar163),ZEXT416((uint)fVar134),0x10);
            goto LAB_00a21851;
          }
          auVar82 = vshufps_avx(auVar314,auVar314,0x50);
          auVar107._8_4_ = 0x3f800000;
          auVar107._0_8_ = 0x3f8000003f800000;
          auVar107._12_4_ = 0x3f800000;
          auVar253 = vsubps_avx(auVar107,auVar82);
          fVar164 = auVar82._0_4_;
          fVar165 = auVar82._4_4_;
          fVar166 = auVar82._8_4_;
          fVar167 = auVar82._12_4_;
          fVar195 = auVar253._0_4_;
          fVar212 = auVar253._4_4_;
          fVar213 = auVar253._8_4_;
          fVar214 = auVar253._12_4_;
          auVar138._0_4_ = local_398._0_4_ * fVar164 + fVar195 * local_358._0_4_;
          auVar138._4_4_ = local_398._4_4_ * fVar165 + fVar212 * local_358._4_4_;
          auVar138._8_4_ = local_398._8_4_ * fVar166 + fVar213 * local_358._8_4_;
          auVar138._12_4_ = local_398._12_4_ * fVar167 + fVar214 * local_358._12_4_;
          auVar183._0_4_ = local_3a8._0_4_ * fVar164 + fVar195 * local_368._0_4_;
          auVar183._4_4_ = local_3a8._4_4_ * fVar165 + fVar212 * local_368._4_4_;
          auVar183._8_4_ = local_3a8._8_4_ * fVar166 + fVar213 * local_368._8_4_;
          auVar183._12_4_ = local_3a8._12_4_ * fVar167 + fVar214 * local_368._12_4_;
          auVar202._0_4_ = local_3b8._0_4_ * fVar164 + local_378._0_4_ * fVar195;
          auVar202._4_4_ = local_3b8._4_4_ * fVar165 + local_378._4_4_ * fVar212;
          auVar202._8_4_ = local_3b8._8_4_ * fVar166 + local_378._8_4_ * fVar213;
          auVar202._12_4_ = local_3b8._12_4_ * fVar167 + local_378._12_4_ * fVar214;
          auVar79._0_4_ = local_3c8._0_4_ * fVar164 + local_388._0_4_ * fVar195;
          auVar79._4_4_ = local_3c8._4_4_ * fVar165 + local_388._4_4_ * fVar212;
          auVar79._8_4_ = local_3c8._8_4_ * fVar166 + local_388._8_4_ * fVar213;
          auVar79._12_4_ = local_3c8._12_4_ * fVar167 + local_388._12_4_ * fVar214;
          auVar131._16_16_ = auVar138;
          auVar131._0_16_ = auVar138;
          auVar160._16_16_ = auVar183;
          auVar160._0_16_ = auVar183;
          auVar194._16_16_ = auVar202;
          auVar194._0_16_ = auVar202;
          _local_4a8 = ZEXT432((uint)fVar163);
          _local_468 = ZEXT416((uint)fVar134);
          auVar93 = ZEXT2032(CONCAT416(fVar134,ZEXT416((uint)fVar163)));
          auVar93 = vshufps_avx(auVar93,auVar93,0);
          auVar13 = vsubps_avx(auVar160,auVar131);
          fVar164 = auVar93._0_4_;
          fVar165 = auVar93._4_4_;
          fVar166 = auVar93._8_4_;
          fVar167 = auVar93._12_4_;
          fVar195 = auVar93._16_4_;
          fVar212 = auVar93._20_4_;
          fVar213 = auVar93._24_4_;
          auVar132._0_4_ = auVar138._0_4_ + auVar13._0_4_ * fVar164;
          auVar132._4_4_ = auVar138._4_4_ + auVar13._4_4_ * fVar165;
          auVar132._8_4_ = auVar138._8_4_ + auVar13._8_4_ * fVar166;
          auVar132._12_4_ = auVar138._12_4_ + auVar13._12_4_ * fVar167;
          auVar132._16_4_ = auVar138._0_4_ + auVar13._16_4_ * fVar195;
          auVar132._20_4_ = auVar138._4_4_ + auVar13._20_4_ * fVar212;
          auVar132._24_4_ = auVar138._8_4_ + auVar13._24_4_ * fVar213;
          auVar132._28_4_ = auVar138._12_4_ + auVar13._28_4_;
          auVar93 = vsubps_avx(auVar194,auVar160);
          auVar161._0_4_ = auVar183._0_4_ + auVar93._0_4_ * fVar164;
          auVar161._4_4_ = auVar183._4_4_ + auVar93._4_4_ * fVar165;
          auVar161._8_4_ = auVar183._8_4_ + auVar93._8_4_ * fVar166;
          auVar161._12_4_ = auVar183._12_4_ + auVar93._12_4_ * fVar167;
          auVar161._16_4_ = auVar183._0_4_ + auVar93._16_4_ * fVar195;
          auVar161._20_4_ = auVar183._4_4_ + auVar93._20_4_ * fVar212;
          auVar161._24_4_ = auVar183._8_4_ + auVar93._24_4_ * fVar213;
          auVar161._28_4_ = auVar183._12_4_ + auVar93._28_4_;
          auVar82 = vsubps_avx(auVar79,auVar202);
          auVar101._0_4_ = auVar202._0_4_ + auVar82._0_4_ * fVar164;
          auVar101._4_4_ = auVar202._4_4_ + auVar82._4_4_ * fVar165;
          auVar101._8_4_ = auVar202._8_4_ + auVar82._8_4_ * fVar166;
          auVar101._12_4_ = auVar202._12_4_ + auVar82._12_4_ * fVar167;
          auVar101._16_4_ = auVar202._0_4_ + auVar82._0_4_ * fVar195;
          auVar101._20_4_ = auVar202._4_4_ + auVar82._4_4_ * fVar212;
          auVar101._24_4_ = auVar202._8_4_ + auVar82._8_4_ * fVar213;
          auVar101._28_4_ = auVar202._12_4_ + auVar82._12_4_;
          auVar93 = vsubps_avx(auVar161,auVar132);
          auVar133._0_4_ = auVar132._0_4_ + fVar164 * auVar93._0_4_;
          auVar133._4_4_ = auVar132._4_4_ + fVar165 * auVar93._4_4_;
          auVar133._8_4_ = auVar132._8_4_ + fVar166 * auVar93._8_4_;
          auVar133._12_4_ = auVar132._12_4_ + fVar167 * auVar93._12_4_;
          auVar133._16_4_ = auVar132._16_4_ + fVar195 * auVar93._16_4_;
          auVar133._20_4_ = auVar132._20_4_ + fVar212 * auVar93._20_4_;
          auVar133._24_4_ = auVar132._24_4_ + fVar213 * auVar93._24_4_;
          auVar133._28_4_ = auVar132._28_4_ + auVar93._28_4_;
          auVar93 = vsubps_avx(auVar101,auVar161);
          auVar102._0_4_ = auVar161._0_4_ + fVar164 * auVar93._0_4_;
          auVar102._4_4_ = auVar161._4_4_ + fVar165 * auVar93._4_4_;
          auVar102._8_4_ = auVar161._8_4_ + fVar166 * auVar93._8_4_;
          auVar102._12_4_ = auVar161._12_4_ + fVar167 * auVar93._12_4_;
          auVar102._16_4_ = auVar161._16_4_ + fVar195 * auVar93._16_4_;
          auVar102._20_4_ = auVar161._20_4_ + fVar212 * auVar93._20_4_;
          auVar102._24_4_ = auVar161._24_4_ + fVar213 * auVar93._24_4_;
          auVar102._28_4_ = auVar161._28_4_ + auVar93._28_4_;
          auVar93 = vsubps_avx(auVar102,auVar133);
          auVar224._0_4_ = auVar133._0_4_ + fVar164 * auVar93._0_4_;
          auVar224._4_4_ = auVar133._4_4_ + fVar165 * auVar93._4_4_;
          auVar224._8_4_ = auVar133._8_4_ + fVar166 * auVar93._8_4_;
          auVar224._12_4_ = auVar133._12_4_ + fVar167 * auVar93._12_4_;
          auVar226._16_4_ = auVar133._16_4_ + fVar195 * auVar93._16_4_;
          auVar226._0_16_ = auVar224;
          auVar226._20_4_ = auVar133._20_4_ + fVar212 * auVar93._20_4_;
          auVar226._24_4_ = auVar133._24_4_ + fVar213 * auVar93._24_4_;
          auVar226._28_4_ = auVar133._28_4_ + auVar161._28_4_;
          auVar232 = auVar226._16_16_;
          auVar109 = vshufps_avx(ZEXT416((uint)(fVar162 * 0.33333334)),
                                 ZEXT416((uint)(fVar162 * 0.33333334)),0);
          auVar184._0_4_ = auVar224._0_4_ + auVar109._0_4_ * auVar93._0_4_ * 3.0;
          auVar184._4_4_ = auVar224._4_4_ + auVar109._4_4_ * auVar93._4_4_ * 3.0;
          auVar184._8_4_ = auVar224._8_4_ + auVar109._8_4_ * auVar93._8_4_ * 3.0;
          auVar184._12_4_ = auVar224._12_4_ + auVar109._12_4_ * auVar93._12_4_ * 3.0;
          auVar154 = vshufpd_avx(auVar224,auVar224,3);
          auVar121 = vshufpd_avx(auVar232,auVar232,3);
          _local_448 = auVar154;
          auVar82 = vsubps_avx(auVar154,auVar224);
          auVar253 = vsubps_avx(auVar121,auVar232);
          auVar80._0_4_ = auVar82._0_4_ + auVar253._0_4_;
          auVar80._4_4_ = auVar82._4_4_ + auVar253._4_4_;
          auVar80._8_4_ = auVar82._8_4_ + auVar253._8_4_;
          auVar80._12_4_ = auVar82._12_4_ + auVar253._12_4_;
          auVar82 = vmovshdup_avx(auVar224);
          auVar253 = vmovshdup_avx(auVar184);
          auVar140 = vshufps_avx(auVar80,auVar80,0);
          auVar110 = vshufps_avx(auVar80,auVar80,0x55);
          fVar164 = auVar110._0_4_;
          fVar165 = auVar110._4_4_;
          fVar166 = auVar110._8_4_;
          fVar167 = auVar110._12_4_;
          fVar195 = auVar140._0_4_;
          fVar212 = auVar140._4_4_;
          fVar213 = auVar140._8_4_;
          fVar214 = auVar140._12_4_;
          auVar81._0_4_ = fVar195 * auVar224._0_4_ + auVar82._0_4_ * fVar164;
          auVar81._4_4_ = fVar212 * auVar224._4_4_ + auVar82._4_4_ * fVar165;
          auVar81._8_4_ = fVar213 * auVar224._8_4_ + auVar82._8_4_ * fVar166;
          auVar81._12_4_ = fVar214 * auVar224._12_4_ + auVar82._12_4_ * fVar167;
          local_348._0_16_ = auVar184;
          auVar294._0_4_ = fVar195 * auVar184._0_4_ + auVar253._0_4_ * fVar164;
          auVar294._4_4_ = fVar212 * auVar184._4_4_ + auVar253._4_4_ * fVar165;
          auVar294._8_4_ = fVar213 * auVar184._8_4_ + auVar253._8_4_ * fVar166;
          auVar294._12_4_ = fVar214 * auVar184._12_4_ + auVar253._12_4_ * fVar167;
          auVar253 = vshufps_avx(auVar81,auVar81,0xe8);
          auVar140 = vshufps_avx(auVar294,auVar294,0xe8);
          auVar82 = vcmpps_avx(auVar253,auVar140,1);
          uVar65 = vextractps_avx(auVar82,0);
          auVar110 = auVar294;
          if ((uVar65 & 1) == 0) {
            auVar110 = auVar81;
          }
          auVar108._0_4_ = auVar109._0_4_ * auVar93._16_4_ * 3.0;
          auVar108._4_4_ = auVar109._4_4_ * auVar93._20_4_ * 3.0;
          auVar108._8_4_ = auVar109._8_4_ * auVar93._24_4_ * 3.0;
          auVar108._12_4_ = auVar109._12_4_ * 0.0;
          auVar254 = vsubps_avx(auVar232,auVar108);
          auVar109 = vmovshdup_avx(auVar254);
          auVar232 = vmovshdup_avx(auVar232);
          fVar215 = auVar254._0_4_;
          fVar216 = auVar254._4_4_;
          auVar203._0_4_ = fVar215 * fVar195 + auVar109._0_4_ * fVar164;
          auVar203._4_4_ = fVar216 * fVar212 + auVar109._4_4_ * fVar165;
          auVar203._8_4_ = auVar254._8_4_ * fVar213 + auVar109._8_4_ * fVar166;
          auVar203._12_4_ = auVar254._12_4_ * fVar214 + auVar109._12_4_ * fVar167;
          auVar328._0_4_ = fVar195 * auVar226._16_4_ + auVar232._0_4_ * fVar164;
          auVar328._4_4_ = fVar212 * auVar226._20_4_ + auVar232._4_4_ * fVar165;
          auVar328._8_4_ = fVar213 * auVar226._24_4_ + auVar232._8_4_ * fVar166;
          auVar328._12_4_ = fVar214 * auVar226._28_4_ + auVar232._12_4_ * fVar167;
          auVar232 = vshufps_avx(auVar203,auVar203,0xe8);
          auVar5 = vshufps_avx(auVar328,auVar328,0xe8);
          auVar109 = vcmpps_avx(auVar232,auVar5,1);
          uVar65 = vextractps_avx(auVar109,0);
          auVar313 = auVar328;
          if ((uVar65 & 1) == 0) {
            auVar313 = auVar203;
          }
          auVar110 = vmaxss_avx(auVar313,auVar110);
          auVar253 = vminps_avx(auVar253,auVar140);
          auVar140 = vminps_avx(auVar232,auVar5);
          auVar140 = vminps_avx(auVar253,auVar140);
          auVar82 = vshufps_avx(auVar82,auVar82,0x55);
          auVar82 = vblendps_avx(auVar82,auVar109,2);
          auVar109 = vpslld_avx(auVar82,0x1f);
          auVar82 = vshufpd_avx(auVar294,auVar294,1);
          auVar82 = vinsertps_avx(auVar82,auVar328,0x9c);
          auVar253 = vshufpd_avx(auVar81,auVar81,1);
          auVar253 = vinsertps_avx(auVar253,auVar203,0x9c);
          auVar82 = vblendvps_avx(auVar253,auVar82,auVar109);
          auVar253 = vmovshdup_avx(auVar82);
          auVar82 = vmaxss_avx(auVar253,auVar82);
          fVar166 = auVar140._0_4_;
          auVar253 = vmovshdup_avx(auVar140);
          fVar165 = auVar82._0_4_;
          fVar167 = auVar253._0_4_;
          fVar164 = auVar110._0_4_;
          auVar97 = _local_248;
          if ((fVar166 < 0.0001) && (-0.0001 < fVar165)) break;
          if ((fVar167 < 0.0001 && -0.0001 < fVar164) || (fVar166 < 0.0001 && -0.0001 < fVar164))
          break;
          auVar109 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar82,1);
          auVar253 = vcmpps_avx(auVar253,SUB6416(ZEXT464(0x38d1b717),0),1);
          auVar253 = vandps_avx(auVar253,auVar109);
        } while ((auVar253 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
        auVar109 = vcmpps_avx(auVar140,_DAT_01f45a50,1);
        auVar253 = vcmpss_avx(auVar110,ZEXT416(0) << 0x20,1);
        auVar139._8_4_ = 0x3f800000;
        auVar139._0_8_ = 0x3f8000003f800000;
        auVar139._12_4_ = 0x3f800000;
        auVar185._8_4_ = 0xbf800000;
        auVar185._0_8_ = 0xbf800000bf800000;
        auVar185._12_4_ = 0xbf800000;
        auVar253 = vblendvps_avx(auVar139,auVar185,auVar253);
        auVar109 = vblendvps_avx(auVar139,auVar185,auVar109);
        auVar140 = vcmpss_avx(auVar109,auVar253,4);
        auVar140 = vpshufd_avx(ZEXT416(auVar140._0_4_ & 1),0x50);
        auVar140 = vpslld_avx(auVar140,0x1f);
        auVar140 = vpsrad_avx(auVar140,0x1f);
        auVar140 = vpandn_avx(auVar140,_DAT_01f7afb0);
        auVar110 = vmovshdup_avx(auVar109);
        fVar195 = auVar110._0_4_;
        if ((auVar109._0_4_ != fVar195) || (NAN(auVar109._0_4_) || NAN(fVar195))) {
          if ((fVar167 != fVar166) || (NAN(fVar167) || NAN(fVar166))) {
            fVar166 = -fVar166 / (fVar167 - fVar166);
            auVar109 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar166) * 0.0 + fVar166)));
          }
          else {
            auVar109 = ZEXT816(0x3f80000000000000);
            if ((fVar166 != 0.0) || (NAN(fVar166))) {
              auVar109 = ZEXT816(0xff8000007f800000);
            }
          }
          auVar232 = vcmpps_avx(auVar140,auVar109,1);
          auVar110 = vblendps_avx(auVar140,auVar109,2);
          auVar109 = vblendps_avx(auVar109,auVar140,2);
          auVar140 = vblendvps_avx(auVar109,auVar110,auVar232);
        }
        auVar82 = vcmpss_avx(auVar82,ZEXT416(0) << 0x20,1);
        auVar141._8_4_ = 0x3f800000;
        auVar141._0_8_ = 0x3f8000003f800000;
        auVar141._12_4_ = 0x3f800000;
        auVar186._8_4_ = 0xbf800000;
        auVar186._0_8_ = 0xbf800000bf800000;
        auVar186._12_4_ = 0xbf800000;
        auVar82 = vblendvps_avx(auVar141,auVar186,auVar82);
        fVar166 = auVar82._0_4_;
        if ((auVar253._0_4_ != fVar166) || (NAN(auVar253._0_4_) || NAN(fVar166))) {
          if ((fVar165 != fVar164) || (NAN(fVar165) || NAN(fVar164))) {
            fVar164 = -fVar164 / (fVar165 - fVar164);
            auVar82 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar164) * 0.0 + fVar164)));
          }
          else {
            auVar82 = ZEXT816(0x3f80000000000000);
            if ((fVar164 != 0.0) || (NAN(fVar164))) {
              auVar82 = ZEXT816(0xff8000007f800000);
            }
          }
          auVar109 = vcmpps_avx(auVar140,auVar82,1);
          auVar253 = vblendps_avx(auVar140,auVar82,2);
          auVar82 = vblendps_avx(auVar82,auVar140,2);
          auVar140 = vblendvps_avx(auVar82,auVar253,auVar109);
        }
        if ((fVar195 != fVar166) || (NAN(fVar195) || NAN(fVar166))) {
          auVar83._8_4_ = 0x3f800000;
          auVar83._0_8_ = 0x3f8000003f800000;
          auVar83._12_4_ = 0x3f800000;
          auVar82 = vcmpps_avx(auVar140,auVar83,1);
          auVar253 = vinsertps_avx(auVar140,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar142._4_12_ = auVar140._4_12_;
          auVar142._0_4_ = 0x3f800000;
          auVar140 = vblendvps_avx(auVar142,auVar253,auVar82);
        }
        auVar82 = vcmpps_avx(auVar140,_DAT_01f46740,1);
        auVar60._12_4_ = 0;
        auVar60._0_12_ = auVar140._4_12_;
        auVar253 = vinsertps_avx(auVar140,ZEXT416(0x3f800000),0x10);
        auVar82 = vblendvps_avx(auVar253,auVar60 << 0x20,auVar82);
        auVar253 = vmovshdup_avx(auVar82);
      } while (auVar253._0_4_ < auVar82._0_4_);
      auVar84._0_4_ = auVar82._0_4_ + -0.1;
      auVar84._4_4_ = auVar82._4_4_ + 0.1;
      auVar84._8_4_ = auVar82._8_4_ + 0.0;
      auVar84._12_4_ = auVar82._12_4_ + 0.0;
      auVar109 = vshufpd_avx(auVar184,auVar184,3);
      local_348._8_8_ = 0x3f80000000000000;
      local_348._0_8_ = 0x3f80000000000000;
      auVar82 = vcmpps_avx(auVar84,local_348._0_16_,1);
      auVar59._12_4_ = 0;
      auVar59._0_12_ = auVar84._4_12_;
      auVar253 = vinsertps_avx(auVar84,SUB6416(ZEXT464(0x3f800000),0),0x10);
      auVar82 = vblendvps_avx(auVar253,auVar59 << 0x20,auVar82);
      auVar253 = vshufpd_avx(auVar254,auVar254,3);
      auVar140 = vshufps_avx(auVar82,auVar82,0x50);
      auVar320._8_4_ = 0x3f800000;
      auVar320._0_8_ = 0x3f8000003f800000;
      auVar320._12_4_ = 0x3f800000;
      auVar110 = vsubps_avx(auVar320,auVar140);
      local_448._0_4_ = auVar154._0_4_;
      local_448._4_4_ = auVar154._4_4_;
      fStack_440 = auVar154._8_4_;
      fStack_43c = auVar154._12_4_;
      fVar164 = auVar140._0_4_;
      fVar165 = auVar140._4_4_;
      fVar166 = auVar140._8_4_;
      fVar167 = auVar140._12_4_;
      local_4f8._0_4_ = auVar121._0_4_;
      local_4f8._4_4_ = auVar121._4_4_;
      fStack_4f0 = auVar121._8_4_;
      fStack_4ec = auVar121._12_4_;
      fVar195 = auVar110._0_4_;
      fVar212 = auVar110._4_4_;
      fVar213 = auVar110._8_4_;
      fVar214 = auVar110._12_4_;
      auVar85._0_4_ = fVar164 * (float)local_448._0_4_ + fVar195 * auVar224._0_4_;
      auVar85._4_4_ = fVar165 * (float)local_448._4_4_ + fVar212 * auVar224._4_4_;
      auVar85._8_4_ = fVar166 * fStack_440 + fVar213 * auVar224._0_4_;
      auVar85._12_4_ = fVar167 * fStack_43c + fVar214 * auVar224._4_4_;
      auVar204._0_4_ = auVar109._0_4_ * fVar164 + fVar195 * auVar184._0_4_;
      auVar204._4_4_ = auVar109._4_4_ * fVar165 + fVar212 * auVar184._4_4_;
      auVar204._8_4_ = auVar109._8_4_ * fVar166 + fVar213 * auVar184._0_4_;
      auVar204._12_4_ = auVar109._12_4_ * fVar167 + fVar214 * auVar184._4_4_;
      auVar240._0_4_ = auVar253._0_4_ * fVar164 + fVar195 * fVar215;
      auVar240._4_4_ = auVar253._4_4_ * fVar165 + fVar212 * fVar216;
      auVar240._8_4_ = auVar253._8_4_ * fVar166 + fVar213 * fVar215;
      auVar240._12_4_ = auVar253._12_4_ * fVar167 + fVar214 * fVar216;
      auVar284._0_4_ = fVar164 * (float)local_4f8._0_4_ + fVar195 * auVar226._16_4_;
      auVar284._4_4_ = fVar165 * (float)local_4f8._4_4_ + fVar212 * auVar226._20_4_;
      auVar284._8_4_ = fVar166 * fStack_4f0 + fVar213 * auVar226._16_4_;
      auVar284._12_4_ = fVar167 * fStack_4ec + fVar214 * auVar226._20_4_;
      auVar121 = vsubps_avx(auVar320,auVar82);
      auVar253 = vmovshdup_avx(auVar314);
      auVar154 = vmovsldup_avx(auVar314);
      auVar329._0_4_ = auVar121._0_4_ * auVar154._0_4_ + auVar82._0_4_ * auVar253._0_4_;
      auVar329._4_4_ = auVar121._4_4_ * auVar154._4_4_ + auVar82._4_4_ * auVar253._4_4_;
      auVar329._8_4_ = auVar121._8_4_ * auVar154._8_4_ + auVar82._8_4_ * auVar253._8_4_;
      auVar329._12_4_ = auVar121._12_4_ * auVar154._12_4_ + auVar82._12_4_ * auVar253._12_4_;
      auVar254 = vmovshdup_avx(auVar329);
      auVar82 = vsubps_avx(auVar204,auVar85);
      auVar143._0_4_ = auVar82._0_4_ * 3.0;
      auVar143._4_4_ = auVar82._4_4_ * 3.0;
      auVar143._8_4_ = auVar82._8_4_ * 3.0;
      auVar143._12_4_ = auVar82._12_4_ * 3.0;
      auVar82 = vsubps_avx(auVar240,auVar204);
      auVar173._0_4_ = auVar82._0_4_ * 3.0;
      auVar173._4_4_ = auVar82._4_4_ * 3.0;
      auVar173._8_4_ = auVar82._8_4_ * 3.0;
      auVar173._12_4_ = auVar82._12_4_ * 3.0;
      auVar82 = vsubps_avx(auVar284,auVar240);
      auVar257._0_4_ = auVar82._0_4_ * 3.0;
      auVar257._4_4_ = auVar82._4_4_ * 3.0;
      auVar257._8_4_ = auVar82._8_4_ * 3.0;
      auVar257._12_4_ = auVar82._12_4_ * 3.0;
      auVar253 = vminps_avx(auVar173,auVar257);
      auVar82 = vmaxps_avx(auVar173,auVar257);
      auVar253 = vminps_avx(auVar143,auVar253);
      auVar82 = vmaxps_avx(auVar143,auVar82);
      auVar154 = vshufpd_avx(auVar253,auVar253,3);
      auVar121 = vshufpd_avx(auVar82,auVar82,3);
      auVar253 = vminps_avx(auVar253,auVar154);
      auVar82 = vmaxps_avx(auVar82,auVar121);
      auVar154 = vshufps_avx(ZEXT416((uint)(1.0 / fVar162)),ZEXT416((uint)(1.0 / fVar162)),0);
      auVar258._0_4_ = auVar154._0_4_ * auVar253._0_4_;
      auVar258._4_4_ = auVar154._4_4_ * auVar253._4_4_;
      auVar258._8_4_ = auVar154._8_4_ * auVar253._8_4_;
      auVar258._12_4_ = auVar154._12_4_ * auVar253._12_4_;
      auVar271._0_4_ = auVar154._0_4_ * auVar82._0_4_;
      auVar271._4_4_ = auVar154._4_4_ * auVar82._4_4_;
      auVar271._8_4_ = auVar154._8_4_ * auVar82._8_4_;
      auVar271._12_4_ = auVar154._12_4_ * auVar82._12_4_;
      auVar110 = ZEXT416((uint)(1.0 / (auVar254._0_4_ - auVar329._0_4_)));
      auVar82 = vshufpd_avx(auVar85,auVar85,3);
      auVar253 = vshufpd_avx(auVar204,auVar204,3);
      auVar154 = vshufpd_avx(auVar240,auVar240,3);
      auVar121 = vshufpd_avx(auVar284,auVar284,3);
      auVar82 = vsubps_avx(auVar82,auVar85);
      auVar109 = vsubps_avx(auVar253,auVar204);
      auVar140 = vsubps_avx(auVar154,auVar240);
      auVar121 = vsubps_avx(auVar121,auVar284);
      auVar253 = vminps_avx(auVar82,auVar109);
      auVar82 = vmaxps_avx(auVar82,auVar109);
      auVar154 = vminps_avx(auVar140,auVar121);
      auVar154 = vminps_avx(auVar253,auVar154);
      auVar253 = vmaxps_avx(auVar140,auVar121);
      auVar82 = vmaxps_avx(auVar82,auVar253);
      auVar253 = vshufps_avx(auVar110,auVar110,0);
      auVar315._0_4_ = auVar253._0_4_ * auVar154._0_4_;
      auVar315._4_4_ = auVar253._4_4_ * auVar154._4_4_;
      auVar315._8_4_ = auVar253._8_4_ * auVar154._8_4_;
      auVar315._12_4_ = auVar253._12_4_ * auVar154._12_4_;
      auVar321._0_4_ = auVar253._0_4_ * auVar82._0_4_;
      auVar321._4_4_ = auVar253._4_4_ * auVar82._4_4_;
      auVar321._8_4_ = auVar253._8_4_ * auVar82._8_4_;
      auVar321._12_4_ = auVar253._12_4_ * auVar82._12_4_;
      auVar82 = vmovsldup_avx(auVar329);
      auVar285._4_12_ = auVar82._4_12_;
      auVar285._0_4_ = fVar163;
      auVar295._4_12_ = auVar329._4_12_;
      auVar295._0_4_ = fVar134;
      auVar174._0_4_ = (fVar163 + fVar134) * 0.5;
      auVar174._4_4_ = (auVar82._4_4_ + auVar329._4_4_) * 0.5;
      auVar174._8_4_ = (auVar82._8_4_ + auVar329._8_4_) * 0.5;
      auVar174._12_4_ = (auVar82._12_4_ + auVar329._12_4_) * 0.5;
      auVar82 = vshufps_avx(auVar174,auVar174,0);
      fVar164 = auVar82._0_4_;
      fVar165 = auVar82._4_4_;
      fVar166 = auVar82._8_4_;
      fVar167 = auVar82._12_4_;
      auVar111._0_4_ = fVar164 * (float)local_1e8._0_4_ + (float)local_4b8._0_4_;
      auVar111._4_4_ = fVar165 * (float)local_1e8._4_4_ + (float)local_4b8._4_4_;
      auVar111._8_4_ = fVar166 * fStack_1e0 + fStack_4b0;
      auVar111._12_4_ = fVar167 * fStack_1dc + fStack_4ac;
      auVar144._0_4_ = fVar164 * (float)local_1f8._0_4_ + (float)local_4c8._0_4_;
      auVar144._4_4_ = fVar165 * (float)local_1f8._4_4_ + (float)local_4c8._4_4_;
      auVar144._8_4_ = fVar166 * fStack_1f0 + fStack_4c0;
      auVar144._12_4_ = fVar167 * fStack_1ec + fStack_4bc;
      auVar205._0_4_ = fVar164 * (float)local_208._0_4_ + (float)local_328._0_4_;
      auVar205._4_4_ = fVar165 * (float)local_208._4_4_ + (float)local_328._4_4_;
      auVar205._8_4_ = fVar166 * fStack_200 + fStack_320;
      auVar205._12_4_ = fVar167 * fStack_1fc + fStack_31c;
      auVar82 = vsubps_avx(auVar144,auVar111);
      auVar112._0_4_ = auVar111._0_4_ + fVar164 * auVar82._0_4_;
      auVar112._4_4_ = auVar111._4_4_ + fVar165 * auVar82._4_4_;
      auVar112._8_4_ = auVar111._8_4_ + fVar166 * auVar82._8_4_;
      auVar112._12_4_ = auVar111._12_4_ + fVar167 * auVar82._12_4_;
      auVar82 = vsubps_avx(auVar205,auVar144);
      auVar145._0_4_ = auVar144._0_4_ + fVar164 * auVar82._0_4_;
      auVar145._4_4_ = auVar144._4_4_ + fVar165 * auVar82._4_4_;
      auVar145._8_4_ = auVar144._8_4_ + fVar166 * auVar82._8_4_;
      auVar145._12_4_ = auVar144._12_4_ + fVar167 * auVar82._12_4_;
      auVar82 = vsubps_avx(auVar145,auVar112);
      fVar164 = auVar112._0_4_ + fVar164 * auVar82._0_4_;
      fVar165 = auVar112._4_4_ + fVar165 * auVar82._4_4_;
      auVar86._0_8_ = CONCAT44(fVar165,fVar164);
      auVar86._8_4_ = auVar112._8_4_ + fVar166 * auVar82._8_4_;
      auVar86._12_4_ = auVar112._12_4_ + fVar167 * auVar82._12_4_;
      fVar166 = auVar82._0_4_ * 3.0;
      fVar167 = auVar82._4_4_ * 3.0;
      auVar113._0_8_ = CONCAT44(fVar167,fVar166);
      auVar113._8_4_ = auVar82._8_4_ * 3.0;
      auVar113._12_4_ = auVar82._12_4_ * 3.0;
      auVar146._8_8_ = auVar86._0_8_;
      auVar146._0_8_ = auVar86._0_8_;
      auVar82 = vshufpd_avx(auVar86,auVar86,3);
      auVar253 = vshufps_avx(auVar174,auVar174,0x55);
      auVar140 = vsubps_avx(auVar82,auVar146);
      auVar302._0_4_ = auVar140._0_4_ * auVar253._0_4_ + fVar164;
      auVar302._4_4_ = auVar140._4_4_ * auVar253._4_4_ + fVar165;
      auVar302._8_4_ = auVar140._8_4_ * auVar253._8_4_ + fVar164;
      auVar302._12_4_ = auVar140._12_4_ * auVar253._12_4_ + fVar165;
      auVar147._8_8_ = auVar113._0_8_;
      auVar147._0_8_ = auVar113._0_8_;
      auVar82 = vshufpd_avx(auVar113,auVar113,1);
      auVar82 = vsubps_avx(auVar82,auVar147);
      auVar114._0_4_ = auVar82._0_4_ * auVar253._0_4_ + fVar166;
      auVar114._4_4_ = auVar82._4_4_ * auVar253._4_4_ + fVar167;
      auVar114._8_4_ = auVar82._8_4_ * auVar253._8_4_ + fVar166;
      auVar114._12_4_ = auVar82._12_4_ * auVar253._12_4_ + fVar167;
      auVar253 = vmovshdup_avx(auVar114);
      auVar206._0_8_ = auVar253._0_8_ ^ 0x8000000080000000;
      auVar206._8_4_ = auVar253._8_4_ ^ 0x80000000;
      auVar206._12_4_ = auVar253._12_4_ ^ 0x80000000;
      auVar154 = vmovshdup_avx(auVar140);
      auVar82 = vunpcklps_avx(auVar154,auVar206);
      auVar121 = vshufps_avx(auVar82,auVar206,4);
      auVar87._0_8_ = auVar140._0_8_ ^ 0x8000000080000000;
      auVar87._8_4_ = -auVar140._8_4_;
      auVar87._12_4_ = -auVar140._12_4_;
      auVar82 = vmovlhps_avx(auVar87,auVar114);
      auVar109 = vshufps_avx(auVar82,auVar114,8);
      auVar82 = ZEXT416((uint)(auVar114._0_4_ * auVar154._0_4_ - auVar140._0_4_ * auVar253._0_4_));
      auVar253 = vshufps_avx(auVar82,auVar82,0);
      auVar82 = vdivps_avx(auVar121,auVar253);
      auVar253 = vdivps_avx(auVar109,auVar253);
      auVar109 = vinsertps_avx(auVar258,auVar315,0x1c);
      auVar140 = vinsertps_avx(auVar271,auVar321,0x1c);
      auVar110 = vinsertps_avx(auVar315,auVar258,0x4c);
      auVar232 = vinsertps_avx(auVar321,auVar271,0x4c);
      auVar154 = vmovsldup_avx(auVar82);
      auVar148._0_4_ = auVar154._0_4_ * auVar109._0_4_;
      auVar148._4_4_ = auVar154._4_4_ * auVar109._4_4_;
      auVar148._8_4_ = auVar154._8_4_ * auVar109._8_4_;
      auVar148._12_4_ = auVar154._12_4_ * auVar109._12_4_;
      auVar115._0_4_ = auVar140._0_4_ * auVar154._0_4_;
      auVar115._4_4_ = auVar140._4_4_ * auVar154._4_4_;
      auVar115._8_4_ = auVar140._8_4_ * auVar154._8_4_;
      auVar115._12_4_ = auVar140._12_4_ * auVar154._12_4_;
      auVar121 = vminps_avx(auVar148,auVar115);
      auVar154 = vmaxps_avx(auVar115,auVar148);
      auVar5 = vmovsldup_avx(auVar253);
      auVar322._0_4_ = auVar110._0_4_ * auVar5._0_4_;
      auVar322._4_4_ = auVar110._4_4_ * auVar5._4_4_;
      auVar322._8_4_ = auVar110._8_4_ * auVar5._8_4_;
      auVar322._12_4_ = auVar110._12_4_ * auVar5._12_4_;
      auVar149._0_4_ = auVar232._0_4_ * auVar5._0_4_;
      auVar149._4_4_ = auVar232._4_4_ * auVar5._4_4_;
      auVar149._8_4_ = auVar232._8_4_ * auVar5._8_4_;
      auVar149._12_4_ = auVar232._12_4_ * auVar5._12_4_;
      auVar5 = vminps_avx(auVar322,auVar149);
      auVar187._0_4_ = auVar121._0_4_ + auVar5._0_4_;
      auVar187._4_4_ = auVar121._4_4_ + auVar5._4_4_;
      auVar187._8_4_ = auVar121._8_4_ + auVar5._8_4_;
      auVar187._12_4_ = auVar121._12_4_ + auVar5._12_4_;
      auVar121 = vmaxps_avx(auVar149,auVar322);
      auVar5 = vsubps_avx(auVar285,auVar174);
      auVar313 = vsubps_avx(auVar295,auVar174);
      auVar116._0_4_ = auVar154._0_4_ + auVar121._0_4_;
      auVar116._4_4_ = auVar154._4_4_ + auVar121._4_4_;
      auVar116._8_4_ = auVar154._8_4_ + auVar121._8_4_;
      auVar116._12_4_ = auVar154._12_4_ + auVar121._12_4_;
      auVar150._8_8_ = 0x3f800000;
      auVar150._0_8_ = 0x3f800000;
      auVar154 = vsubps_avx(auVar150,auVar116);
      auVar121 = vsubps_avx(auVar150,auVar187);
      fVar213 = auVar5._0_4_;
      auVar188._0_4_ = fVar213 * auVar154._0_4_;
      fVar214 = auVar5._4_4_;
      auVar188._4_4_ = fVar214 * auVar154._4_4_;
      fVar215 = auVar5._8_4_;
      auVar188._8_4_ = fVar215 * auVar154._8_4_;
      fVar216 = auVar5._12_4_;
      auVar188._12_4_ = fVar216 * auVar154._12_4_;
      fVar166 = auVar313._0_4_;
      auVar117._0_4_ = fVar166 * auVar154._0_4_;
      fVar167 = auVar313._4_4_;
      auVar117._4_4_ = fVar167 * auVar154._4_4_;
      fVar195 = auVar313._8_4_;
      auVar117._8_4_ = fVar195 * auVar154._8_4_;
      fVar212 = auVar313._12_4_;
      auVar117._12_4_ = fVar212 * auVar154._12_4_;
      auVar286._0_4_ = fVar213 * auVar121._0_4_;
      auVar286._4_4_ = fVar214 * auVar121._4_4_;
      auVar286._8_4_ = fVar215 * auVar121._8_4_;
      auVar286._12_4_ = fVar216 * auVar121._12_4_;
      auVar151._0_4_ = fVar166 * auVar121._0_4_;
      auVar151._4_4_ = fVar167 * auVar121._4_4_;
      auVar151._8_4_ = fVar195 * auVar121._8_4_;
      auVar151._12_4_ = fVar212 * auVar121._12_4_;
      auVar154 = vminps_avx(auVar188,auVar286);
      auVar121 = vminps_avx(auVar117,auVar151);
      auVar5 = vminps_avx(auVar154,auVar121);
      auVar154 = vmaxps_avx(auVar286,auVar188);
      auVar121 = vmaxps_avx(auVar151,auVar117);
      auVar313 = vshufps_avx(auVar174,auVar174,0x54);
      auVar121 = vmaxps_avx(auVar121,auVar154);
      auVar6 = vshufps_avx(auVar302,auVar302,0);
      auVar74 = vshufps_avx(auVar302,auVar302,0x55);
      auVar154 = vhaddps_avx(auVar5,auVar5);
      auVar121 = vhaddps_avx(auVar121,auVar121);
      auVar175._0_4_ = auVar6._0_4_ * auVar82._0_4_ + auVar74._0_4_ * auVar253._0_4_;
      auVar175._4_4_ = auVar6._4_4_ * auVar82._4_4_ + auVar74._4_4_ * auVar253._4_4_;
      auVar175._8_4_ = auVar6._8_4_ * auVar82._8_4_ + auVar74._8_4_ * auVar253._8_4_;
      auVar175._12_4_ = auVar6._12_4_ * auVar82._12_4_ + auVar74._12_4_ * auVar253._12_4_;
      auVar5 = vsubps_avx(auVar313,auVar175);
      fVar164 = auVar5._0_4_ + auVar154._0_4_;
      fVar165 = auVar5._0_4_ + auVar121._0_4_;
      auVar154 = vmaxss_avx(ZEXT416((uint)fVar163),ZEXT416((uint)fVar164));
      auVar121 = vminss_avx(ZEXT416((uint)fVar165),ZEXT416((uint)fVar134));
    } while (auVar121._0_4_ < auVar154._0_4_);
    auVar154 = vmovshdup_avx(auVar82);
    auVar88._0_4_ = auVar154._0_4_ * auVar109._0_4_;
    auVar88._4_4_ = auVar154._4_4_ * auVar109._4_4_;
    auVar88._8_4_ = auVar154._8_4_ * auVar109._8_4_;
    auVar88._12_4_ = auVar154._12_4_ * auVar109._12_4_;
    auVar118._0_4_ = auVar140._0_4_ * auVar154._0_4_;
    auVar118._4_4_ = auVar140._4_4_ * auVar154._4_4_;
    auVar118._8_4_ = auVar140._8_4_ * auVar154._8_4_;
    auVar118._12_4_ = auVar140._12_4_ * auVar154._12_4_;
    auVar121 = vminps_avx(auVar88,auVar118);
    auVar154 = vmaxps_avx(auVar118,auVar88);
    auVar109 = vmovshdup_avx(auVar253);
    auVar189._0_4_ = auVar110._0_4_ * auVar109._0_4_;
    auVar189._4_4_ = auVar110._4_4_ * auVar109._4_4_;
    auVar189._8_4_ = auVar110._8_4_ * auVar109._8_4_;
    auVar189._12_4_ = auVar110._12_4_ * auVar109._12_4_;
    auVar119._0_4_ = auVar232._0_4_ * auVar109._0_4_;
    auVar119._4_4_ = auVar232._4_4_ * auVar109._4_4_;
    auVar119._8_4_ = auVar232._8_4_ * auVar109._8_4_;
    auVar119._12_4_ = auVar232._12_4_ * auVar109._12_4_;
    auVar109 = vminps_avx(auVar189,auVar119);
    auVar152._0_4_ = auVar121._0_4_ + auVar109._0_4_;
    auVar152._4_4_ = auVar121._4_4_ + auVar109._4_4_;
    auVar152._8_4_ = auVar121._8_4_ + auVar109._8_4_;
    auVar152._12_4_ = auVar121._12_4_ + auVar109._12_4_;
    auVar121 = vmaxps_avx(auVar119,auVar189);
    auVar89._0_4_ = auVar154._0_4_ + auVar121._0_4_;
    auVar89._4_4_ = auVar154._4_4_ + auVar121._4_4_;
    auVar89._8_4_ = auVar154._8_4_ + auVar121._8_4_;
    auVar89._12_4_ = auVar154._12_4_ + auVar121._12_4_;
    auVar154 = vsubps_avx(local_348._0_16_,auVar89);
    auVar121 = vsubps_avx(local_348._0_16_,auVar152);
    auVar153._0_4_ = fVar213 * auVar154._0_4_;
    auVar153._4_4_ = fVar214 * auVar154._4_4_;
    auVar153._8_4_ = fVar215 * auVar154._8_4_;
    auVar153._12_4_ = fVar216 * auVar154._12_4_;
    auVar190._0_4_ = fVar213 * auVar121._0_4_;
    auVar190._4_4_ = fVar214 * auVar121._4_4_;
    auVar190._8_4_ = fVar215 * auVar121._8_4_;
    auVar190._12_4_ = fVar216 * auVar121._12_4_;
    auVar90._0_4_ = fVar166 * auVar154._0_4_;
    auVar90._4_4_ = fVar167 * auVar154._4_4_;
    auVar90._8_4_ = fVar195 * auVar154._8_4_;
    auVar90._12_4_ = fVar212 * auVar154._12_4_;
    auVar120._0_4_ = fVar166 * auVar121._0_4_;
    auVar120._4_4_ = fVar167 * auVar121._4_4_;
    auVar120._8_4_ = fVar195 * auVar121._8_4_;
    auVar120._12_4_ = fVar212 * auVar121._12_4_;
    auVar154 = vminps_avx(auVar153,auVar190);
    auVar121 = vminps_avx(auVar90,auVar120);
    auVar154 = vminps_avx(auVar154,auVar121);
    auVar121 = vmaxps_avx(auVar190,auVar153);
    auVar109 = vmaxps_avx(auVar120,auVar90);
    auVar154 = vhaddps_avx(auVar154,auVar154);
    auVar121 = vmaxps_avx(auVar109,auVar121);
    auVar121 = vhaddps_avx(auVar121,auVar121);
    auVar109 = vmovshdup_avx(auVar5);
    auVar140 = ZEXT416((uint)(auVar109._0_4_ + auVar154._0_4_));
    auVar154 = vmaxss_avx(auVar329,auVar140);
    auVar109 = ZEXT416((uint)(auVar109._0_4_ + auVar121._0_4_));
    auVar121 = vminss_avx(auVar109,auVar254);
  } while (auVar121._0_4_ < auVar154._0_4_);
  uVar65 = 0;
  if ((fVar163 < fVar164) && (fVar165 < fVar134)) {
    auVar154 = vcmpps_avx(auVar109,auVar254,1);
    auVar121 = vcmpps_avx(auVar329,auVar140,1);
    auVar154 = vandps_avx(auVar121,auVar154);
    uVar65 = auVar154._0_4_;
  }
  auVar259._8_4_ = 0x7fffffff;
  auVar259._0_8_ = 0x7fffffff7fffffff;
  auVar259._12_4_ = 0x7fffffff;
  if (((uint)uVar71 < 4 && 0.001 <= fVar162) && (uVar65 & 1) == 0) goto LAB_00a22da0;
  lVar67 = 0xc9;
  do {
    lVar67 = lVar67 + -1;
    if (lVar67 == 0) goto LAB_00a21eb4;
    fVar162 = auVar5._0_4_;
    fVar134 = 1.0 - fVar162;
    auVar154 = ZEXT416((uint)(fVar134 * fVar134 * fVar134));
    auVar154 = vshufps_avx(auVar154,auVar154,0);
    auVar121 = ZEXT416((uint)(fVar162 * 3.0 * fVar134 * fVar134));
    auVar121 = vshufps_avx(auVar121,auVar121,0);
    auVar109 = ZEXT416((uint)(fVar134 * fVar162 * fVar162 * 3.0));
    auVar109 = vshufps_avx(auVar109,auVar109,0);
    auVar140 = ZEXT416((uint)(fVar162 * fVar162 * fVar162));
    auVar140 = vshufps_avx(auVar140,auVar140,0);
    fVar134 = (float)local_4b8._0_4_ * auVar154._0_4_ +
              (float)local_4c8._0_4_ * auVar121._0_4_ +
              (float)local_218._0_4_ * auVar140._0_4_ + (float)local_328._0_4_ * auVar109._0_4_;
    fVar162 = (float)local_4b8._4_4_ * auVar154._4_4_ +
              (float)local_4c8._4_4_ * auVar121._4_4_ +
              (float)local_218._4_4_ * auVar140._4_4_ + (float)local_328._4_4_ * auVar109._4_4_;
    auVar91._0_8_ = CONCAT44(fVar162,fVar134);
    auVar91._8_4_ =
         fStack_4b0 * auVar154._8_4_ +
         fStack_4c0 * auVar121._8_4_ + fStack_210 * auVar140._8_4_ + fStack_320 * auVar109._8_4_;
    auVar91._12_4_ =
         fStack_4ac * auVar154._12_4_ +
         fStack_4bc * auVar121._12_4_ + fStack_20c * auVar140._12_4_ + fStack_31c * auVar109._12_4_;
    auVar122._8_8_ = auVar91._0_8_;
    auVar122._0_8_ = auVar91._0_8_;
    auVar121 = vshufpd_avx(auVar91,auVar91,1);
    auVar154 = vmovshdup_avx(auVar5);
    auVar121 = vsubps_avx(auVar121,auVar122);
    auVar92._0_4_ = auVar154._0_4_ * auVar121._0_4_ + fVar134;
    auVar92._4_4_ = auVar154._4_4_ * auVar121._4_4_ + fVar162;
    auVar92._8_4_ = auVar154._8_4_ * auVar121._8_4_ + fVar134;
    auVar92._12_4_ = auVar154._12_4_ * auVar121._12_4_ + fVar162;
    auVar154 = vshufps_avx(auVar92,auVar92,0);
    auVar121 = vshufps_avx(auVar92,auVar92,0x55);
    auVar123._0_4_ = auVar82._0_4_ * auVar154._0_4_ + auVar253._0_4_ * auVar121._0_4_;
    auVar123._4_4_ = auVar82._4_4_ * auVar154._4_4_ + auVar253._4_4_ * auVar121._4_4_;
    auVar123._8_4_ = auVar82._8_4_ * auVar154._8_4_ + auVar253._8_4_ * auVar121._8_4_;
    auVar123._12_4_ = auVar82._12_4_ * auVar154._12_4_ + auVar253._12_4_ * auVar121._12_4_;
    auVar5 = vsubps_avx(auVar5,auVar123);
    auVar154 = vandps_avx(auVar259,auVar92);
    auVar121 = vshufps_avx(auVar154,auVar154,0xf5);
    auVar154 = vmaxss_avx(auVar121,auVar154);
  } while ((float)local_228._0_4_ <= auVar154._0_4_);
  fVar134 = auVar5._0_4_;
  if ((fVar134 < 0.0) || (1.0 < fVar134)) goto LAB_00a21eb4;
  auVar82 = vmovshdup_avx(auVar5);
  fVar162 = auVar82._0_4_;
  if ((fVar162 < 0.0) || (1.0 < fVar162)) goto LAB_00a21eb4;
  auVar82 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                          ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),0x1c);
  auVar232 = vinsertps_avx(auVar82,ZEXT416((uint)(pre->ray_space).vz.field_0.m128[2]),0x28);
  aVar4 = (ray->org).field_0;
  auVar82 = vsubps_avx(_local_3d8,(undefined1  [16])aVar4);
  auVar82 = vdpps_avx(auVar82,auVar232,0x7f);
  auVar253 = vsubps_avx(_local_408,(undefined1  [16])aVar4);
  auVar253 = vdpps_avx(auVar253,auVar232,0x7f);
  auVar154 = vsubps_avx(_local_418,(undefined1  [16])aVar4);
  auVar154 = vdpps_avx(auVar154,auVar232,0x7f);
  auVar121 = vsubps_avx(_local_3f8,(undefined1  [16])aVar4);
  auVar121 = vdpps_avx(auVar121,auVar232,0x7f);
  auVar109 = vsubps_avx(_local_3e8,(undefined1  [16])aVar4);
  auVar109 = vdpps_avx(auVar109,auVar232,0x7f);
  auVar140 = vsubps_avx(_local_428,(undefined1  [16])aVar4);
  auVar140 = vdpps_avx(auVar140,auVar232,0x7f);
  auVar110 = vsubps_avx(_local_2d8,(undefined1  [16])aVar4);
  auVar110 = vdpps_avx(auVar110,auVar232,0x7f);
  auVar63._4_4_ = fStack_474;
  auVar63._0_4_ = local_478;
  auVar63._8_4_ = fStack_470;
  auVar63._12_4_ = fStack_46c;
  auVar254 = vsubps_avx(auVar63,(undefined1  [16])aVar4);
  auVar232 = vdpps_avx(auVar254,auVar232,0x7f);
  fVar167 = 1.0 - fVar162;
  fVar195 = 1.0 - fVar134;
  fVar163 = auVar5._4_4_;
  fVar164 = auVar5._8_4_;
  fVar165 = auVar5._12_4_;
  fVar166 = fVar195 * fVar134 * fVar134 * 3.0;
  auVar207._0_4_ = fVar134 * fVar134 * fVar134;
  auVar207._4_4_ = fVar163 * fVar163 * fVar163;
  auVar207._8_4_ = fVar164 * fVar164 * fVar164;
  auVar207._12_4_ = fVar165 * fVar165 * fVar165;
  fVar163 = fVar134 * 3.0 * fVar195 * fVar195;
  fVar164 = fVar195 * fVar195 * fVar195;
  fVar134 = (fVar167 * auVar82._0_4_ + auVar109._0_4_ * fVar162) * fVar164 +
            fVar163 * (auVar140._0_4_ * fVar162 + fVar167 * auVar253._0_4_) +
            fVar166 * (auVar110._0_4_ * fVar162 + fVar167 * auVar154._0_4_) +
            auVar207._0_4_ * (fVar167 * auVar121._0_4_ + fVar162 * auVar232._0_4_);
  if ((fVar134 < (ray->org).field_0.m128[3]) || (fVar162 = ray->tfar, fVar162 < fVar134))
  goto LAB_00a21eb4;
  pGVar8 = (context->scene->geometries).items[local_480].ptr;
  if ((pGVar8->mask & ray->mask) != 0) {
    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
       (bVar64 = 1, pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_00a22d87;
    auVar82 = vshufps_avx(auVar5,auVar5,0x55);
    auVar260._8_4_ = 0x3f800000;
    auVar260._0_8_ = 0x3f8000003f800000;
    auVar260._12_4_ = 0x3f800000;
    auVar253 = vsubps_avx(auVar260,auVar82);
    fVar165 = auVar82._0_4_;
    fVar167 = auVar82._4_4_;
    fVar212 = auVar82._8_4_;
    fVar213 = auVar82._12_4_;
    fVar214 = auVar253._0_4_;
    fVar215 = auVar253._4_4_;
    fVar216 = auVar253._8_4_;
    fVar217 = auVar253._12_4_;
    auVar272._0_4_ = fVar165 * (float)local_3e8._0_4_ + fVar214 * (float)local_3d8._0_4_;
    auVar272._4_4_ = fVar167 * (float)local_3e8._4_4_ + fVar215 * (float)local_3d8._4_4_;
    auVar272._8_4_ = fVar212 * fStack_3e0 + fVar216 * fStack_3d0;
    auVar272._12_4_ = fVar213 * fStack_3dc + fVar217 * fStack_3cc;
    auVar287._0_4_ = fVar165 * (float)local_428._0_4_ + fVar214 * (float)local_408._0_4_;
    auVar287._4_4_ = fVar167 * (float)local_428._4_4_ + fVar215 * (float)local_408._4_4_;
    auVar287._8_4_ = fVar212 * fStack_420 + fVar216 * fStack_400;
    auVar287._12_4_ = fVar213 * fStack_41c + fVar217 * fStack_3fc;
    auVar296._0_4_ = fVar165 * (float)local_2d8._0_4_ + fVar214 * (float)local_418._0_4_;
    auVar296._4_4_ = fVar167 * (float)local_2d8._4_4_ + fVar215 * (float)local_418._4_4_;
    auVar296._8_4_ = fVar212 * fStack_2d0 + fVar216 * fStack_410;
    auVar296._12_4_ = fVar213 * fStack_2cc + fVar217 * fStack_40c;
    auVar241._0_4_ = fVar214 * (float)local_3f8._0_4_ + fVar165 * local_478;
    auVar241._4_4_ = fVar215 * (float)local_3f8._4_4_ + fVar167 * fStack_474;
    auVar241._8_4_ = fVar216 * fStack_3f0 + fVar212 * fStack_470;
    auVar241._12_4_ = fVar217 * fStack_3ec + fVar213 * fStack_46c;
    auVar121 = vsubps_avx(auVar287,auVar272);
    auVar109 = vsubps_avx(auVar296,auVar287);
    auVar140 = vsubps_avx(auVar241,auVar296);
    auVar82 = vshufps_avx(auVar5,auVar5,0);
    fVar213 = auVar82._0_4_;
    fVar214 = auVar82._4_4_;
    fVar215 = auVar82._8_4_;
    fVar216 = auVar82._12_4_;
    auVar82 = vshufps_avx(ZEXT416((uint)fVar195),ZEXT416((uint)fVar195),0);
    fVar165 = auVar82._0_4_;
    fVar167 = auVar82._4_4_;
    fVar195 = auVar82._8_4_;
    fVar212 = auVar82._12_4_;
    auVar82 = vshufps_avx(auVar207,auVar207,0);
    auVar253 = vshufps_avx(ZEXT416((uint)fVar166),ZEXT416((uint)fVar166),0);
    auVar154 = vshufps_avx(ZEXT416((uint)fVar163),ZEXT416((uint)fVar163),0);
    auVar191._0_4_ =
         ((auVar121._0_4_ * fVar165 + fVar213 * auVar109._0_4_) * fVar165 +
         fVar213 * (auVar109._0_4_ * fVar165 + fVar213 * auVar140._0_4_)) * 3.0;
    auVar191._4_4_ =
         ((auVar121._4_4_ * fVar167 + fVar214 * auVar109._4_4_) * fVar167 +
         fVar214 * (auVar109._4_4_ * fVar167 + fVar214 * auVar140._4_4_)) * 3.0;
    auVar191._8_4_ =
         ((auVar121._8_4_ * fVar195 + fVar215 * auVar109._8_4_) * fVar195 +
         fVar215 * (auVar109._8_4_ * fVar195 + fVar215 * auVar140._8_4_)) * 3.0;
    auVar191._12_4_ =
         ((auVar121._12_4_ * fVar212 + fVar216 * auVar109._12_4_) * fVar212 +
         fVar216 * (auVar109._12_4_ * fVar212 + fVar216 * auVar140._12_4_)) * 3.0;
    auVar121 = vshufps_avx(ZEXT416((uint)fVar164),ZEXT416((uint)fVar164),0);
    auVar124._0_4_ =
         auVar121._0_4_ * (float)local_258._0_4_ +
         auVar154._0_4_ * (float)local_268._0_4_ +
         auVar82._0_4_ * (float)local_288._0_4_ + auVar253._0_4_ * (float)local_278._0_4_;
    auVar124._4_4_ =
         auVar121._4_4_ * (float)local_258._4_4_ +
         auVar154._4_4_ * (float)local_268._4_4_ +
         auVar82._4_4_ * (float)local_288._4_4_ + auVar253._4_4_ * (float)local_278._4_4_;
    auVar124._8_4_ =
         auVar121._8_4_ * fStack_250 +
         auVar154._8_4_ * fStack_260 + auVar82._8_4_ * fStack_280 + auVar253._8_4_ * fStack_270;
    auVar124._12_4_ =
         auVar121._12_4_ * fStack_24c +
         auVar154._12_4_ * fStack_25c + auVar82._12_4_ * fStack_27c + auVar253._12_4_ * fStack_26c;
    auVar82 = vshufps_avx(auVar191,auVar191,0xc9);
    auVar155._0_4_ = auVar124._0_4_ * auVar82._0_4_;
    auVar155._4_4_ = auVar124._4_4_ * auVar82._4_4_;
    auVar155._8_4_ = auVar124._8_4_ * auVar82._8_4_;
    auVar155._12_4_ = auVar124._12_4_ * auVar82._12_4_;
    auVar82 = vshufps_avx(auVar124,auVar124,0xc9);
    auVar125._0_4_ = auVar191._0_4_ * auVar82._0_4_;
    auVar125._4_4_ = auVar191._4_4_ * auVar82._4_4_;
    auVar125._8_4_ = auVar191._8_4_ * auVar82._8_4_;
    auVar125._12_4_ = auVar191._12_4_ * auVar82._12_4_;
    auVar253 = vsubps_avx(auVar125,auVar155);
    auVar82 = vshufps_avx(auVar253,auVar253,0xe9);
    local_2b8 = vmovlps_avx(auVar82);
    local_2b0 = auVar253._0_4_;
    local_2ac = vmovlps_avx(auVar5);
    local_2a4 = (int)local_310;
    local_2a0 = (int)local_480;
    local_29c = context->user->instID[0];
    local_298 = context->user->instPrimID[0];
    ray->tfar = fVar134;
    local_4cc = -1;
    local_308.valid = &local_4cc;
    local_308.geometryUserPtr = pGVar8->userPtr;
    local_308.context = context->user;
    local_308.hit = (RTCHitN *)&local_2b8;
    local_308.N = 1;
    local_308.ray = (RTCRayN *)ray;
    if (pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00a22d33:
      p_Var9 = context->args->filter;
      if ((p_Var9 == (RTCFilterFunctionN)0x0) ||
         ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
            RTC_RAY_QUERY_FLAG_INCOHERENT && (((pGVar8->field_8).field_0x2 & 0x40) == 0)) ||
          ((*p_Var9)(&local_308), *local_308.valid != 0)))) {
        bVar64 = 1;
        goto LAB_00a22d87;
      }
    }
    else {
      _local_4a8 = ZEXT432((uint)uVar72);
      (*pGVar8->occlusionFilterN)(&local_308);
      uVar72 = (ulong)(uint)local_4a8._0_4_;
      if (*local_308.valid != 0) goto LAB_00a22d33;
    }
    ray->tfar = fVar162;
  }
  bVar64 = 0;
LAB_00a22d87:
  uVar72 = CONCAT71((int7)(uVar72 >> 8),(byte)uVar72 | bVar64);
  auVar97 = _local_248;
  goto LAB_00a21eb4;
LAB_00a22da0:
  _local_4f8 = vinsertps_avx(ZEXT416((uint)fVar163),ZEXT416((uint)fVar134),0x10);
  auVar227 = ZEXT1664(local_358);
  auVar248 = ZEXT1664(local_368);
  auVar330 = ZEXT1664(local_378);
  auVar276 = ZEXT1664(local_388);
  auVar291 = ZEXT1664(local_398);
  auVar263 = ZEXT1664(local_3a8);
  auVar300 = ZEXT1664(local_3b8);
  auVar304 = ZEXT1664(local_3c8);
  auVar317 = ZEXT1664(auVar329);
  goto LAB_00a21851;
}

Assistant:

static __forceinline bool occluded_n(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }